

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  bool bVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  undefined8 unaff_RBP;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar129;
  float t1;
  undefined4 uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vfloat4 b0;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vfloat4 b0_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vfloat4 a0_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar207;
  float fVar215;
  float fVar216;
  vfloat4 a0_1;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar218;
  float fVar225;
  float fVar226;
  vfloat4 a0;
  float fVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_358 [16];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  
  uVar31 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar80 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar43 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  fVar139 = fVar1 * auVar43._0_4_;
  fVar122 = fVar1 * auVar80._0_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar14);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar41);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar51);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar31 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar5);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar31 * 0xc + 6);
  auVar94 = vpmovsxbd_avx2(auVar50);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar31 * 0xd + 6);
  auVar105 = vpmovsxbd_avx2(auVar49);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar31 * 0x12 + 6);
  auVar106 = vpmovsxbd_avx2(auVar48);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar31 * 0x13 + 6);
  auVar97 = vpmovsxbd_avx2(auVar6);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar31 * 0x14 + 6);
  auVar89 = vpmovsxbd_avx2(auVar47);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar96 = vcvtdq2ps_avx(auVar89);
  auVar108._4_4_ = fVar122;
  auVar108._0_4_ = fVar122;
  auVar108._8_4_ = fVar122;
  auVar108._12_4_ = fVar122;
  auVar108._16_4_ = fVar122;
  auVar108._20_4_ = fVar122;
  auVar108._24_4_ = fVar122;
  auVar108._28_4_ = fVar122;
  auVar152._8_4_ = 1;
  auVar152._0_8_ = 0x100000001;
  auVar152._12_4_ = 1;
  auVar152._16_4_ = 1;
  auVar152._20_4_ = 1;
  auVar152._24_4_ = 1;
  auVar152._28_4_ = 1;
  auVar98 = ZEXT1632(CONCAT412(fVar1 * auVar80._12_4_,
                               CONCAT48(fVar1 * auVar80._8_4_,
                                        CONCAT44(fVar1 * auVar80._4_4_,fVar122))));
  auVar90 = vpermps_avx2(auVar152,auVar98);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar87);
  auVar88 = vpermps_avx512vl(auVar87,auVar98);
  fVar122 = auVar88._0_4_;
  fVar206 = auVar88._4_4_;
  auVar98._4_4_ = fVar206 * auVar92._4_4_;
  auVar98._0_4_ = fVar122 * auVar92._0_4_;
  fVar196 = auVar88._8_4_;
  auVar98._8_4_ = fVar196 * auVar92._8_4_;
  fVar204 = auVar88._12_4_;
  auVar98._12_4_ = fVar204 * auVar92._12_4_;
  fVar205 = auVar88._16_4_;
  auVar98._16_4_ = fVar205 * auVar92._16_4_;
  fVar128 = auVar88._20_4_;
  auVar98._20_4_ = fVar128 * auVar92._20_4_;
  fVar129 = auVar88._24_4_;
  auVar98._24_4_ = fVar129 * auVar92._24_4_;
  auVar98._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar105._4_4_ * fVar206;
  auVar89._0_4_ = auVar105._0_4_ * fVar122;
  auVar89._8_4_ = auVar105._8_4_ * fVar196;
  auVar89._12_4_ = auVar105._12_4_ * fVar204;
  auVar89._16_4_ = auVar105._16_4_ * fVar205;
  auVar89._20_4_ = auVar105._20_4_ * fVar128;
  auVar89._24_4_ = auVar105._24_4_ * fVar129;
  auVar89._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar96._4_4_ * fVar206;
  auVar97._0_4_ = auVar96._0_4_ * fVar122;
  auVar97._8_4_ = auVar96._8_4_ * fVar196;
  auVar97._12_4_ = auVar96._12_4_ * fVar204;
  auVar97._16_4_ = auVar96._16_4_ * fVar205;
  auVar97._20_4_ = auVar96._20_4_ * fVar128;
  auVar97._24_4_ = auVar96._24_4_ * fVar129;
  auVar97._28_4_ = auVar88._28_4_;
  auVar14 = vfmadd231ps_fma(auVar98,auVar90,auVar91);
  auVar41 = vfmadd231ps_fma(auVar89,auVar90,auVar94);
  auVar51 = vfmadd231ps_fma(auVar97,auVar95,auVar90);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar108,auVar93);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar108,auVar104);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar106,auVar108);
  auVar109._4_4_ = fVar139;
  auVar109._0_4_ = fVar139;
  auVar109._8_4_ = fVar139;
  auVar109._12_4_ = fVar139;
  auVar109._16_4_ = fVar139;
  auVar109._20_4_ = fVar139;
  auVar109._24_4_ = fVar139;
  auVar109._28_4_ = fVar139;
  auVar89 = ZEXT1632(CONCAT412(fVar1 * auVar43._12_4_,
                               CONCAT48(fVar1 * auVar43._8_4_,
                                        CONCAT44(fVar1 * auVar43._4_4_,fVar139))));
  auVar97 = vpermps_avx2(auVar152,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  auVar90 = vmulps_avx512vl(auVar89,auVar92);
  auVar100._0_4_ = auVar89._0_4_ * auVar105._0_4_;
  auVar100._4_4_ = auVar89._4_4_ * auVar105._4_4_;
  auVar100._8_4_ = auVar89._8_4_ * auVar105._8_4_;
  auVar100._12_4_ = auVar89._12_4_ * auVar105._12_4_;
  auVar100._16_4_ = auVar89._16_4_ * auVar105._16_4_;
  auVar100._20_4_ = auVar89._20_4_ * auVar105._20_4_;
  auVar100._24_4_ = auVar89._24_4_ * auVar105._24_4_;
  auVar100._28_4_ = 0;
  auVar105._4_4_ = auVar89._4_4_ * auVar96._4_4_;
  auVar105._0_4_ = auVar89._0_4_ * auVar96._0_4_;
  auVar105._8_4_ = auVar89._8_4_ * auVar96._8_4_;
  auVar105._12_4_ = auVar89._12_4_ * auVar96._12_4_;
  auVar105._16_4_ = auVar89._16_4_ * auVar96._16_4_;
  auVar105._20_4_ = auVar89._20_4_ * auVar96._20_4_;
  auVar105._24_4_ = auVar89._24_4_ * auVar96._24_4_;
  auVar105._28_4_ = auVar92._28_4_;
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar91);
  auVar5 = vfmadd231ps_fma(auVar100,auVar97,auVar94);
  auVar50 = vfmadd231ps_fma(auVar105,auVar97,auVar95);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar109,auVar93);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar109,auVar104);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar109,auVar106);
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  auVar93 = vandps_avx(ZEXT1632(auVar14),auVar102);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar93,auVar107,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar90._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar14._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar14._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar14._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar14._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar41),auVar102);
  uVar35 = vcmpps_avx512vl(auVar93,auVar107,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar87._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar51),auVar102);
  uVar35 = vcmpps_avx512vl(auVar93,auVar107,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar93._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar90,auVar92,auVar103);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar87);
  auVar41 = vfnmadd213ps_fma(auVar87,auVar92,auVar103);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar93);
  auVar51 = vfnmadd213ps_fma(auVar93,auVar92,auVar103);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar92,auVar92);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar91);
  auVar106._4_4_ = auVar14._4_4_ * auVar93._4_4_;
  auVar106._0_4_ = auVar14._0_4_ * auVar93._0_4_;
  auVar106._8_4_ = auVar14._8_4_ * auVar93._8_4_;
  auVar106._12_4_ = auVar14._12_4_ * auVar93._12_4_;
  auVar106._16_4_ = auVar93._16_4_ * 0.0;
  auVar106._20_4_ = auVar93._20_4_ * 0.0;
  auVar106._24_4_ = auVar93._24_4_ * 0.0;
  auVar106._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar91);
  auVar101._0_4_ = auVar14._0_4_ * auVar93._0_4_;
  auVar101._4_4_ = auVar14._4_4_ * auVar93._4_4_;
  auVar101._8_4_ = auVar14._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar14._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar5));
  auVar95._4_4_ = auVar41._4_4_ * auVar93._4_4_;
  auVar95._0_4_ = auVar41._0_4_ * auVar93._0_4_;
  auVar95._8_4_ = auVar41._8_4_ * auVar93._8_4_;
  auVar95._12_4_ = auVar41._12_4_ * auVar93._12_4_;
  auVar95._16_4_ = auVar93._16_4_ * 0.0;
  auVar95._20_4_ = auVar93._20_4_ * 0.0;
  auVar95._24_4_ = auVar93._24_4_ * 0.0;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar5));
  auVar99._0_4_ = auVar41._0_4_ * auVar93._0_4_;
  auVar99._4_4_ = auVar41._4_4_ * auVar93._4_4_;
  auVar99._8_4_ = auVar41._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar41._12_4_ * auVar93._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar50));
  auVar96._4_4_ = auVar93._4_4_ * auVar51._4_4_;
  auVar96._0_4_ = auVar93._0_4_ * auVar51._0_4_;
  auVar96._8_4_ = auVar93._8_4_ * auVar51._8_4_;
  auVar96._12_4_ = auVar93._12_4_ * auVar51._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar50));
  auVar88._0_4_ = auVar51._0_4_ * auVar93._0_4_;
  auVar88._4_4_ = auVar51._4_4_ * auVar93._4_4_;
  auVar88._8_4_ = auVar51._8_4_ * auVar93._8_4_;
  auVar88._12_4_ = auVar51._12_4_ * auVar93._12_4_;
  auVar88._16_4_ = auVar93._16_4_ * 0.0;
  auVar88._20_4_ = auVar93._20_4_ * 0.0;
  auVar88._24_4_ = auVar93._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar106,auVar101);
  auVar91 = vpminsd_avx2(auVar95,auVar99);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar96,auVar88);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar92._4_4_ = uVar130;
  auVar92._0_4_ = uVar130;
  auVar92._8_4_ = uVar130;
  auVar92._12_4_ = uVar130;
  auVar92._16_4_ = uVar130;
  auVar92._20_4_ = uVar130;
  auVar92._24_4_ = uVar130;
  auVar92._28_4_ = uVar130;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar106,auVar101);
  auVar91 = vpmaxsd_avx2(auVar95,auVar99);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar96,auVar88);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar104._4_4_ = uVar130;
  auVar104._0_4_ = uVar130;
  auVar104._8_4_ = uVar130;
  auVar104._12_4_ = uVar130;
  auVar104._16_4_ = uVar130;
  auVar104._20_4_ = uVar130;
  auVar104._24_4_ = uVar130;
  auVar104._28_4_ = uVar130;
  auVar91 = vminps_avx512vl(auVar91,auVar104);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar94);
  auVar91 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_78,auVar93,2);
  uVar16 = vpcmpgtd_avx512vl(auVar91,_DAT_01fb4ba0);
  uVar35 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar16));
  auVar14 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar41);
  auVar246 = ZEXT464(0x3f800000);
  auVar41 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar245 = ZEXT1664(auVar41);
LAB_019f7678:
  if (uVar35 == 0) {
    return;
  }
  lVar32 = 0;
  for (uVar31 = uVar35; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar32 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar7].ptr;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar8);
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar41 = *(undefined1 (*) [16])(_Var13 + uVar31 * (long)pvVar12);
  auVar51 = *(undefined1 (*) [16])(_Var13 + (uVar31 + 1) * (long)pvVar12);
  auVar5 = *(undefined1 (*) [16])(_Var13 + (uVar31 + 2) * (long)pvVar12);
  auVar50 = *(undefined1 (*) [16])(_Var13 + (long)pvVar12 * (uVar31 + 3));
  lVar32 = *(long *)&pGVar10[1].time_range.upper;
  auVar49 = *(undefined1 (*) [16])(lVar32 + (long)p_Var11 * uVar31);
  auVar48 = *(undefined1 (*) [16])(lVar32 + (long)p_Var11 * (uVar31 + 1));
  auVar6 = *(undefined1 (*) [16])(lVar32 + (long)p_Var11 * (uVar31 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar47 = *(undefined1 (*) [16])(lVar32 + (long)p_Var11 * (uVar31 + 3));
  if (uVar35 != 0) {
    uVar36 = uVar35 - 1 & uVar35;
    for (uVar31 = uVar35; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    }
    if (uVar36 != 0) {
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x30);
  auVar62 = ZEXT816(0) << 0x40;
  auVar45._0_4_ = auVar47._0_4_ * 0.0;
  auVar45._4_4_ = auVar47._4_4_ * 0.0;
  auVar45._8_4_ = auVar47._8_4_ * 0.0;
  auVar45._12_4_ = auVar47._12_4_ * 0.0;
  auVar78._8_4_ = 0x3e2aaaab;
  auVar78._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar78._12_4_ = 0x3e2aaaab;
  auVar43 = vfmadd213ps_fma(auVar78,auVar6,auVar45);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar42);
  auVar123 = vfmadd231ps_fma(auVar43,auVar49,auVar78);
  auVar133 = auVar237._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar6,auVar133);
  auVar43 = vfnmadd231ps_fma(auVar43,auVar48,auVar62);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar49,auVar133);
  auVar79._0_4_ = auVar50._0_4_ * 0.0;
  auVar79._4_4_ = auVar50._4_4_ * 0.0;
  auVar79._8_4_ = auVar50._8_4_ * 0.0;
  auVar79._12_4_ = auVar50._12_4_ * 0.0;
  auVar43 = vfmadd213ps_fma(auVar78,auVar5,auVar79);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar42);
  auVar43 = vfmadd231ps_fma(auVar43,auVar41,auVar78);
  auVar45 = vfmadd231ps_avx512vl(auVar79,auVar5,auVar133);
  auVar45 = vfnmadd231ps_fma(auVar45,auVar51,auVar62);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar41,auVar133);
  auVar140._0_4_ = auVar47._0_4_ * 0.16666667;
  auVar140._4_4_ = auVar47._4_4_ * 0.16666667;
  auVar140._8_4_ = auVar47._8_4_ * 0.16666667;
  auVar140._12_4_ = auVar47._12_4_ * 0.16666667;
  auVar45 = vfmadd231ps_avx512vl(auVar140,auVar6,auVar42);
  auVar45 = vfmadd231ps_fma(auVar45,auVar48,auVar78);
  auVar45 = vfmadd231ps_fma(auVar45,auVar49,auVar62);
  auVar47 = vmulps_avx512vl(auVar47,auVar133);
  auVar6 = vfmadd231ps_fma(auVar47,auVar62,auVar6);
  auVar48 = vfnmadd231ps_avx512vl(auVar6,auVar133,auVar48);
  auVar6 = vfnmadd231ps_fma(auVar48,auVar62,auVar49);
  auVar69._0_4_ = auVar50._0_4_ * 0.16666667;
  auVar69._4_4_ = auVar50._4_4_ * 0.16666667;
  auVar69._8_4_ = auVar50._8_4_ * 0.16666667;
  auVar69._12_4_ = auVar50._12_4_ * 0.16666667;
  auVar49 = vfmadd231ps_avx512vl(auVar69,auVar5,auVar42);
  auVar49 = vfmadd231ps_fma(auVar49,auVar51,auVar78);
  auVar49 = vfmadd231ps_fma(auVar49,auVar41,auVar62);
  auVar50 = vmulps_avx512vl(auVar50,auVar133);
  auVar5 = vfmadd231ps_fma(auVar50,auVar62,auVar5);
  auVar51 = vfnmadd231ps_avx512vl(auVar5,auVar133,auVar51);
  auVar48 = vfnmadd231ps_fma(auVar51,auVar62,auVar41);
  auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar205 = auVar44._0_4_;
  auVar54._0_4_ = fVar205 * auVar51._0_4_;
  fVar128 = auVar44._4_4_;
  auVar54._4_4_ = fVar128 * auVar51._4_4_;
  fVar129 = auVar44._8_4_;
  auVar54._8_4_ = fVar129 * auVar51._8_4_;
  fVar139 = auVar44._12_4_;
  auVar54._12_4_ = fVar139 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar54,auVar41,auVar43);
  auVar5 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar55._0_4_ = fVar205 * auVar51._0_4_;
  auVar55._4_4_ = fVar128 * auVar51._4_4_;
  auVar55._8_4_ = fVar129 * auVar51._8_4_;
  auVar55._12_4_ = fVar139 * auVar51._12_4_;
  auVar41 = vfmsub231ps_fma(auVar55,auVar41,auVar46);
  auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar6,auVar6,0xc9);
  auVar51 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar150 = auVar6._0_4_;
  auVar52._0_4_ = fVar150 * auVar51._0_4_;
  fVar154 = auVar6._4_4_;
  auVar52._4_4_ = fVar154 * auVar51._4_4_;
  fVar155 = auVar6._8_4_;
  auVar52._8_4_ = fVar155 * auVar51._8_4_;
  fVar156 = auVar6._12_4_;
  auVar52._12_4_ = fVar156 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar52,auVar41,auVar49);
  auVar49 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar70._0_4_ = auVar51._0_4_ * fVar150;
  auVar70._4_4_ = auVar51._4_4_ * fVar154;
  auVar70._8_4_ = auVar51._8_4_ * fVar155;
  auVar70._12_4_ = auVar51._12_4_ * fVar156;
  auVar51 = vfmsub231ps_fma(auVar70,auVar41,auVar48);
  auVar41 = vdpps_avx(auVar5,auVar5,0x7f);
  auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar206 = auVar41._0_4_;
  auVar71._4_12_ = ZEXT812(0) << 0x20;
  auVar71._0_4_ = fVar206;
  auVar51 = vrsqrt14ss_avx512f(auVar62,auVar71);
  auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar122 = auVar51._0_4_;
  auVar51 = vdpps_avx(auVar5,auVar50,0x7f);
  fVar122 = auVar47._0_4_ + auVar43._0_4_ * fVar122 * fVar122 * fVar122;
  fVar207 = fVar122 * auVar5._0_4_;
  fVar215 = fVar122 * auVar5._4_4_;
  fVar216 = fVar122 * auVar5._8_4_;
  fVar217 = fVar122 * auVar5._12_4_;
  auVar85._0_4_ = auVar50._0_4_ * fVar206;
  auVar85._4_4_ = auVar50._4_4_ * fVar206;
  auVar85._8_4_ = auVar50._8_4_ * fVar206;
  auVar85._12_4_ = auVar50._12_4_ * fVar206;
  fVar206 = auVar51._0_4_;
  auVar64._0_4_ = fVar206 * auVar5._0_4_;
  auVar64._4_4_ = fVar206 * auVar5._4_4_;
  auVar64._8_4_ = fVar206 * auVar5._8_4_;
  auVar64._12_4_ = fVar206 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar85,auVar64);
  auVar51 = vrcp14ss_avx512f(auVar62,auVar71);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar51,ZEXT416(0x40000000));
  fVar196 = auVar51._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar49,auVar49,0x7f);
  fVar204 = auVar41._0_4_;
  auVar82._4_12_ = ZEXT812(0) << 0x20;
  auVar82._0_4_ = fVar204;
  auVar51 = vrsqrt14ss_avx512f(auVar62,auVar82);
  auVar50 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar206 = auVar51._0_4_;
  fVar206 = auVar50._0_4_ + auVar47._0_4_ * fVar206 * fVar206 * fVar206;
  auVar51 = vdpps_avx(auVar49,auVar48,0x7f);
  fVar218 = fVar206 * auVar49._0_4_;
  fVar225 = fVar206 * auVar49._4_4_;
  fVar226 = fVar206 * auVar49._8_4_;
  fVar227 = fVar206 * auVar49._12_4_;
  auVar56._0_4_ = fVar204 * auVar48._0_4_;
  auVar56._4_4_ = fVar204 * auVar48._4_4_;
  auVar56._8_4_ = fVar204 * auVar48._8_4_;
  auVar56._12_4_ = fVar204 * auVar48._12_4_;
  fVar204 = auVar51._0_4_;
  auVar53._0_4_ = fVar204 * auVar49._0_4_;
  auVar53._4_4_ = fVar204 * auVar49._4_4_;
  auVar53._8_4_ = fVar204 * auVar49._8_4_;
  auVar53._12_4_ = fVar204 * auVar49._12_4_;
  auVar50 = vsubps_avx(auVar56,auVar53);
  auVar51 = vrcp14ss_avx512f(auVar62,auVar82);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar51,ZEXT416(0x40000000));
  fVar204 = auVar41._0_4_ * auVar51._0_4_;
  auVar41 = vshufps_avx(auVar123,auVar123,0xff);
  auVar66._0_4_ = fVar207 * auVar41._0_4_;
  auVar66._4_4_ = fVar215 * auVar41._4_4_;
  auVar66._8_4_ = fVar216 * auVar41._8_4_;
  auVar66._12_4_ = fVar217 * auVar41._12_4_;
  auVar48 = vsubps_avx(auVar123,auVar66);
  auVar51 = vshufps_avx(auVar44,auVar44,0xff);
  auVar57._0_4_ = auVar51._0_4_ * fVar207 + auVar41._0_4_ * fVar122 * fVar196 * auVar5._0_4_;
  auVar57._4_4_ = auVar51._4_4_ * fVar215 + auVar41._4_4_ * fVar122 * fVar196 * auVar5._4_4_;
  auVar57._8_4_ = auVar51._8_4_ * fVar216 + auVar41._8_4_ * fVar122 * fVar196 * auVar5._8_4_;
  auVar57._12_4_ = auVar51._12_4_ * fVar217 + auVar41._12_4_ * fVar122 * fVar196 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar44,auVar57);
  auVar231._0_4_ = auVar66._0_4_ + auVar123._0_4_;
  auVar231._4_4_ = auVar66._4_4_ + auVar123._4_4_;
  auVar231._8_4_ = auVar66._8_4_ + auVar123._8_4_;
  auVar231._12_4_ = auVar66._12_4_ + auVar123._12_4_;
  auVar41 = vshufps_avx(auVar45,auVar45,0xff);
  auVar60._0_4_ = fVar218 * auVar41._0_4_;
  auVar60._4_4_ = fVar225 * auVar41._4_4_;
  auVar60._8_4_ = fVar226 * auVar41._8_4_;
  auVar60._12_4_ = fVar227 * auVar41._12_4_;
  auVar52 = vsubps_avx512vl(auVar45,auVar60);
  auVar51 = vshufps_avx(auVar6,auVar6,0xff);
  auVar46._0_4_ = auVar51._0_4_ * fVar218 + auVar41._0_4_ * fVar206 * auVar50._0_4_ * fVar204;
  auVar46._4_4_ = auVar51._4_4_ * fVar225 + auVar41._4_4_ * fVar206 * auVar50._4_4_ * fVar204;
  auVar46._8_4_ = auVar51._8_4_ * fVar226 + auVar41._8_4_ * fVar206 * auVar50._8_4_ * fVar204;
  auVar46._12_4_ = auVar51._12_4_ * fVar227 + auVar41._12_4_ * fVar206 * auVar50._12_4_ * fVar204;
  auVar41 = vsubps_avx(auVar6,auVar46);
  auVar219._0_4_ = auVar45._0_4_ + auVar60._0_4_;
  auVar219._4_4_ = auVar45._4_4_ + auVar60._4_4_;
  auVar219._8_4_ = auVar45._8_4_ + auVar60._8_4_;
  auVar219._12_4_ = auVar45._12_4_ + auVar60._12_4_;
  auVar141._0_4_ = auVar5._0_4_ * 0.33333334;
  auVar141._4_4_ = auVar5._4_4_ * 0.33333334;
  auVar141._8_4_ = auVar5._8_4_ * 0.33333334;
  auVar141._12_4_ = auVar5._12_4_ * 0.33333334;
  auVar53 = vaddps_avx512vl(auVar48,auVar141);
  auVar142._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar142._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar142._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar142._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar54 = vsubps_avx512vl(auVar52,auVar142);
  auVar43._0_4_ = (fVar205 + auVar57._0_4_) * 0.33333334;
  auVar43._4_4_ = (fVar128 + auVar57._4_4_) * 0.33333334;
  auVar43._8_4_ = (fVar129 + auVar57._8_4_) * 0.33333334;
  auVar43._12_4_ = (fVar139 + auVar57._12_4_) * 0.33333334;
  auVar55 = vaddps_avx512vl(auVar231,auVar43);
  auVar42._0_4_ = (fVar150 + auVar46._0_4_) * 0.33333334;
  auVar42._4_4_ = (fVar154 + auVar46._4_4_) * 0.33333334;
  auVar42._8_4_ = (fVar155 + auVar46._8_4_) * 0.33333334;
  auVar42._12_4_ = (fVar156 + auVar46._12_4_) * 0.33333334;
  auVar56 = vsubps_avx512vl(auVar219,auVar42);
  auVar6 = vsubps_avx(auVar48,auVar80);
  uVar130 = auVar6._0_4_;
  auVar62._4_4_ = uVar130;
  auVar62._0_4_ = uVar130;
  auVar62._8_4_ = uVar130;
  auVar62._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar6,auVar6,0x55);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  auVar51 = vshufps_avx(auVar6,auVar6,0xaa);
  fVar122 = pre->ray_space[k].vz.field_0.m128[0];
  fVar206 = pre->ray_space[k].vz.field_0.m128[1];
  fVar196 = pre->ray_space[k].vz.field_0.m128[2];
  fVar204 = pre->ray_space[k].vz.field_0.m128[3];
  auVar44._0_4_ = fVar122 * auVar51._0_4_;
  auVar44._4_4_ = fVar206 * auVar51._4_4_;
  auVar44._8_4_ = fVar196 * auVar51._8_4_;
  auVar44._12_4_ = fVar204 * auVar51._12_4_;
  auVar41 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar41);
  auVar42 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar62);
  auVar57 = vsubps_avx512vl(auVar53,auVar80);
  uVar130 = auVar57._0_4_;
  auVar58._4_4_ = uVar130;
  auVar58._0_4_ = uVar130;
  auVar58._8_4_ = uVar130;
  auVar58._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar57,auVar57,0x55);
  auVar51 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar133._0_4_ = fVar122 * auVar51._0_4_;
  auVar133._4_4_ = fVar206 * auVar51._4_4_;
  auVar133._8_4_ = fVar196 * auVar51._8_4_;
  auVar133._12_4_ = fVar204 * auVar51._12_4_;
  auVar41 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar4,auVar41);
  auVar44 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar58);
  auVar58 = vsubps_avx512vl(auVar54,auVar80);
  uVar130 = auVar58._0_4_;
  auVar61._4_4_ = uVar130;
  auVar61._0_4_ = uVar130;
  auVar61._8_4_ = uVar130;
  auVar61._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar58,auVar58,0x55);
  auVar51 = vshufps_avx(auVar58,auVar58,0xaa);
  auVar59._0_4_ = fVar122 * auVar51._0_4_;
  auVar59._4_4_ = fVar206 * auVar51._4_4_;
  auVar59._8_4_ = fVar196 * auVar51._8_4_;
  auVar59._12_4_ = fVar204 * auVar51._12_4_;
  auVar41 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar4,auVar41);
  auVar46 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar61);
  auVar59 = vsubps_avx512vl(auVar52,auVar80);
  uVar130 = auVar59._0_4_;
  auVar67._4_4_ = uVar130;
  auVar67._0_4_ = uVar130;
  auVar67._8_4_ = uVar130;
  auVar67._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar59,auVar59,0x55);
  auVar51 = vshufps_avx(auVar59,auVar59,0xaa);
  auVar63._0_4_ = fVar122 * auVar51._0_4_;
  auVar63._4_4_ = fVar206 * auVar51._4_4_;
  auVar63._8_4_ = fVar196 * auVar51._8_4_;
  auVar63._12_4_ = fVar204 * auVar51._12_4_;
  auVar41 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar41);
  auVar62 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar67);
  auVar47 = vsubps_avx(auVar231,auVar80);
  uVar130 = auVar47._0_4_;
  auVar68._4_4_ = uVar130;
  auVar68._0_4_ = uVar130;
  auVar68._8_4_ = uVar130;
  auVar68._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar47,auVar47,0x55);
  auVar51 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar75._0_4_ = auVar51._0_4_ * fVar122;
  auVar75._4_4_ = auVar51._4_4_ * fVar206;
  auVar75._8_4_ = auVar51._8_4_ * fVar196;
  auVar75._12_4_ = auVar51._12_4_ * fVar204;
  auVar41 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar41);
  auVar133 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar68);
  auVar60 = vsubps_avx512vl(auVar55,auVar80);
  uVar130 = auVar60._0_4_;
  auVar72._4_4_ = uVar130;
  auVar72._0_4_ = uVar130;
  auVar72._8_4_ = uVar130;
  auVar72._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar60,auVar60,0x55);
  auVar51 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar76._0_4_ = auVar51._0_4_ * fVar122;
  auVar76._4_4_ = auVar51._4_4_ * fVar206;
  auVar76._8_4_ = auVar51._8_4_ * fVar196;
  auVar76._12_4_ = auVar51._12_4_ * fVar204;
  auVar41 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar41);
  auVar140 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar72);
  auVar61 = vsubps_avx512vl(auVar56,auVar80);
  uVar130 = auVar61._0_4_;
  auVar86._4_4_ = uVar130;
  auVar86._0_4_ = uVar130;
  auVar86._8_4_ = uVar130;
  auVar86._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar61,auVar61,0x55);
  auVar51 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar77._0_4_ = auVar51._0_4_ * fVar122;
  auVar77._4_4_ = auVar51._4_4_ * fVar206;
  auVar77._8_4_ = auVar51._8_4_ * fVar196;
  auVar77._12_4_ = auVar51._12_4_ * fVar204;
  auVar41 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar41);
  auVar141 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar86);
  auVar43 = vsubps_avx(auVar219,auVar80);
  uVar130 = auVar43._0_4_;
  auVar123._4_4_ = uVar130;
  auVar123._0_4_ = uVar130;
  auVar123._8_4_ = uVar130;
  auVar123._12_4_ = uVar130;
  auVar41 = vshufps_avx(auVar43,auVar43,0x55);
  auVar51 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar65._0_4_ = auVar51._0_4_ * fVar122;
  auVar65._4_4_ = auVar51._4_4_ * fVar206;
  auVar65._8_4_ = auVar51._8_4_ * fVar196;
  auVar65._12_4_ = auVar51._12_4_ * fVar204;
  auVar41 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar4,auVar41);
  auVar142 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar123);
  auVar5 = vmovlhps_avx(auVar42,auVar133);
  auVar50 = vmovlhps_avx(auVar44,auVar140);
  auVar123 = vmovlhps_avx512f(auVar46,auVar141);
  auVar45 = vmovlhps_avx512f(auVar62,auVar142);
  auVar51 = vminps_avx(auVar5,auVar50);
  auVar41 = vmaxps_avx(auVar5,auVar50);
  auVar49 = vminps_avx512vl(auVar123,auVar45);
  auVar51 = vminps_avx(auVar51,auVar49);
  auVar49 = vmaxps_avx512vl(auVar123,auVar45);
  auVar41 = vmaxps_avx(auVar41,auVar49);
  auVar49 = vshufpd_avx(auVar51,auVar51,3);
  auVar51 = vminps_avx(auVar51,auVar49);
  auVar49 = vshufpd_avx(auVar41,auVar41,3);
  auVar41 = vmaxps_avx(auVar41,auVar49);
  auVar51 = vandps_avx512vl(auVar51,auVar238._0_16_);
  auVar41 = vandps_avx512vl(auVar41,auVar238._0_16_);
  auVar41 = vmaxps_avx(auVar51,auVar41);
  auVar51 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar51,auVar41);
  fVar122 = auVar41._0_4_ * 9.536743e-07;
  auVar42 = vmovddup_avx512vl(auVar42);
  auVar44 = vmovddup_avx512vl(auVar44);
  auVar46 = vmovddup_avx512vl(auVar46);
  auVar131._8_8_ = auVar62._0_8_;
  auVar131._0_8_ = auVar62._0_8_;
  auVar93 = vbroadcastss_avx512vl(ZEXT416((uint)fVar122));
  auVar41 = vxorps_avx512vl(auVar93._0_16_,auVar239._0_16_);
  auVar91 = vbroadcastss_avx512vl(auVar41);
  uVar31 = 0;
  auVar41 = vsubps_avx(auVar50,auVar5);
  auVar62 = vsubps_avx512vl(auVar123,auVar50);
  auVar63 = vsubps_avx512vl(auVar45,auVar123);
  auVar51 = vsubps_avx(auVar231,auVar48);
  auVar64 = vsubps_avx512vl(auVar55,auVar53);
  auVar65 = vsubps_avx512vl(auVar56,auVar54);
  auVar66 = vsubps_avx512vl(auVar219,auVar52);
  auVar67 = vpbroadcastd_avx512vl();
  auVar68 = vpbroadcastd_avx512vl();
  auVar49 = ZEXT816(0x3f80000000000000);
  auVar80 = auVar49;
LAB_019f7ddc:
  do {
    auVar72 = vshufps_avx(auVar80,auVar80,0x50);
    auVar83._8_4_ = 0x3f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._12_4_ = 0x3f800000;
    auVar230._16_4_ = 0x3f800000;
    auVar230._0_16_ = auVar83;
    auVar230._20_4_ = 0x3f800000;
    auVar230._24_4_ = 0x3f800000;
    auVar230._28_4_ = 0x3f800000;
    auVar86 = vsubps_avx(auVar83,auVar72);
    fVar206 = auVar72._0_4_;
    fVar128 = auVar133._0_4_;
    auVar73._0_4_ = fVar128 * fVar206;
    fVar196 = auVar72._4_4_;
    fVar129 = auVar133._4_4_;
    auVar73._4_4_ = fVar129 * fVar196;
    fVar204 = auVar72._8_4_;
    auVar73._8_4_ = fVar128 * fVar204;
    fVar205 = auVar72._12_4_;
    auVar73._12_4_ = fVar129 * fVar205;
    fVar139 = auVar140._0_4_;
    auVar74._0_4_ = fVar139 * fVar206;
    fVar150 = auVar140._4_4_;
    auVar74._4_4_ = fVar150 * fVar196;
    auVar74._8_4_ = fVar139 * fVar204;
    auVar74._12_4_ = fVar150 * fVar205;
    fVar154 = auVar141._0_4_;
    auVar81._0_4_ = fVar154 * fVar206;
    fVar155 = auVar141._4_4_;
    auVar81._4_4_ = fVar155 * fVar196;
    auVar81._8_4_ = fVar154 * fVar204;
    auVar81._12_4_ = fVar155 * fVar205;
    fVar156 = auVar142._0_4_;
    auVar134._0_4_ = fVar156 * fVar206;
    fVar207 = auVar142._4_4_;
    auVar134._4_4_ = fVar207 * fVar196;
    auVar134._8_4_ = fVar156 * fVar204;
    auVar134._12_4_ = fVar207 * fVar205;
    auVar69 = vfmadd231ps_avx512vl(auVar73,auVar86,auVar42);
    auVar70 = vfmadd231ps_avx512vl(auVar74,auVar86,auVar44);
    auVar71 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar46);
    auVar86 = vfmadd231ps_fma(auVar134,auVar131,auVar86);
    auVar72 = vmovshdup_avx(auVar49);
    fVar196 = auVar49._0_4_;
    fVar206 = (auVar72._0_4_ - fVar196) * 0.04761905;
    auVar179._4_4_ = fVar196;
    auVar179._0_4_ = fVar196;
    auVar179._8_4_ = fVar196;
    auVar179._12_4_ = fVar196;
    auVar179._16_4_ = fVar196;
    auVar179._20_4_ = fVar196;
    auVar179._24_4_ = fVar196;
    auVar179._28_4_ = fVar196;
    auVar148._0_8_ = auVar72._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    auVar92 = vsubps_avx(auVar148,auVar179);
    uVar130 = auVar69._0_4_;
    auVar149._4_4_ = uVar130;
    auVar149._0_4_ = uVar130;
    auVar149._8_4_ = uVar130;
    auVar149._12_4_ = uVar130;
    auVar149._16_4_ = uVar130;
    auVar149._20_4_ = uVar130;
    auVar149._24_4_ = uVar130;
    auVar149._28_4_ = uVar130;
    auVar193._8_4_ = 1;
    auVar193._0_8_ = 0x100000001;
    auVar193._12_4_ = 1;
    auVar193._16_4_ = 1;
    auVar193._20_4_ = 1;
    auVar193._24_4_ = 1;
    auVar193._28_4_ = 1;
    auVar105 = ZEXT1632(auVar69);
    auVar104 = vpermps_avx2(auVar193,auVar105);
    auVar94 = vbroadcastss_avx512vl(auVar70);
    auVar106 = ZEXT1632(auVar70);
    auVar95 = vpermps_avx512vl(auVar193,auVar106);
    auVar96 = vbroadcastss_avx512vl(auVar71);
    auVar100 = ZEXT1632(auVar71);
    auVar97 = vpermps_avx512vl(auVar193,auVar100);
    auVar89 = vbroadcastss_avx512vl(auVar86);
    auVar101 = ZEXT1632(auVar86);
    auVar90 = vpermps_avx512vl(auVar193,auVar101);
    auVar194._4_4_ = fVar206;
    auVar194._0_4_ = fVar206;
    auVar194._8_4_ = fVar206;
    auVar194._12_4_ = fVar206;
    auVar194._16_4_ = fVar206;
    auVar194._20_4_ = fVar206;
    auVar194._24_4_ = fVar206;
    auVar194._28_4_ = fVar206;
    auVar102 = auVar244._0_32_;
    auVar98 = vpermps_avx512vl(auVar102,auVar105);
    auVar174._8_4_ = 3;
    auVar174._0_8_ = 0x300000003;
    auVar174._12_4_ = 3;
    auVar174._16_4_ = 3;
    auVar174._20_4_ = 3;
    auVar174._24_4_ = 3;
    auVar174._28_4_ = 3;
    auVar87 = vpermps_avx512vl(auVar174,auVar105);
    auVar88 = vpermps_avx512vl(auVar102,auVar106);
    auVar105 = vpermps_avx2(auVar174,auVar106);
    auVar99 = vpermps_avx512vl(auVar102,auVar100);
    auVar106 = vpermps_avx2(auVar174,auVar100);
    auVar100 = vpermps_avx512vl(auVar102,auVar101);
    auVar101 = vpermps_avx512vl(auVar174,auVar101);
    auVar72 = vfmadd132ps_fma(auVar92,auVar179,_DAT_01f7b040);
    auVar92 = vsubps_avx(auVar230,ZEXT1632(auVar72));
    auVar102 = vmulps_avx512vl(auVar94,ZEXT1632(auVar72));
    auVar107 = ZEXT1632(auVar72);
    auVar103 = vmulps_avx512vl(auVar95,auVar107);
    auVar86 = vfmadd231ps_fma(auVar102,auVar92,auVar149);
    auVar69 = vfmadd231ps_fma(auVar103,auVar92,auVar104);
    auVar102 = vmulps_avx512vl(auVar96,auVar107);
    auVar103 = vmulps_avx512vl(auVar97,auVar107);
    auVar94 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar95);
    auVar102 = vmulps_avx512vl(auVar89,auVar107);
    auVar103 = ZEXT1632(auVar72);
    auVar90 = vmulps_avx512vl(auVar90,auVar103);
    auVar96 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar97);
    fVar204 = auVar72._0_4_;
    fVar205 = auVar72._4_4_;
    auVar162._4_4_ = fVar205 * auVar94._4_4_;
    auVar162._0_4_ = fVar204 * auVar94._0_4_;
    fVar215 = auVar72._8_4_;
    auVar162._8_4_ = fVar215 * auVar94._8_4_;
    fVar216 = auVar72._12_4_;
    auVar162._12_4_ = fVar216 * auVar94._12_4_;
    auVar162._16_4_ = auVar94._16_4_ * 0.0;
    auVar162._20_4_ = auVar94._20_4_ * 0.0;
    auVar162._24_4_ = auVar94._24_4_ * 0.0;
    auVar162._28_4_ = fVar196;
    auVar20._4_4_ = fVar205 * auVar95._4_4_;
    auVar20._0_4_ = fVar204 * auVar95._0_4_;
    auVar20._8_4_ = fVar215 * auVar95._8_4_;
    auVar20._12_4_ = fVar216 * auVar95._12_4_;
    auVar20._16_4_ = auVar95._16_4_ * 0.0;
    auVar20._20_4_ = auVar95._20_4_ * 0.0;
    auVar20._24_4_ = auVar95._24_4_ * 0.0;
    auVar20._28_4_ = auVar104._28_4_;
    auVar86 = vfmadd231ps_fma(auVar162,auVar92,ZEXT1632(auVar86));
    auVar69 = vfmadd231ps_fma(auVar20,auVar92,ZEXT1632(auVar69));
    auVar137._0_4_ = fVar204 * auVar96._0_4_;
    auVar137._4_4_ = fVar205 * auVar96._4_4_;
    auVar137._8_4_ = fVar215 * auVar96._8_4_;
    auVar137._12_4_ = fVar216 * auVar96._12_4_;
    auVar137._16_4_ = auVar96._16_4_ * 0.0;
    auVar137._20_4_ = auVar96._20_4_ * 0.0;
    auVar137._24_4_ = auVar96._24_4_ * 0.0;
    auVar137._28_4_ = 0;
    auVar21._4_4_ = fVar205 * auVar97._4_4_;
    auVar21._0_4_ = fVar204 * auVar97._0_4_;
    auVar21._8_4_ = fVar215 * auVar97._8_4_;
    auVar21._12_4_ = fVar216 * auVar97._12_4_;
    auVar21._16_4_ = auVar97._16_4_ * 0.0;
    auVar21._20_4_ = auVar97._20_4_ * 0.0;
    auVar21._24_4_ = auVar97._24_4_ * 0.0;
    auVar21._28_4_ = auVar96._28_4_;
    auVar70 = vfmadd231ps_fma(auVar137,auVar92,auVar94);
    auVar71 = vfmadd231ps_fma(auVar21,auVar92,auVar95);
    auVar22._28_4_ = auVar95._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * auVar71._12_4_,
                            CONCAT48(fVar215 * auVar71._8_4_,
                                     CONCAT44(fVar205 * auVar71._4_4_,fVar204 * auVar71._0_4_))));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar70._12_4_,
                                                 CONCAT48(fVar215 * auVar70._8_4_,
                                                          CONCAT44(fVar205 * auVar70._4_4_,
                                                                   fVar204 * auVar70._0_4_)))),
                              auVar92,ZEXT1632(auVar86));
    auVar85 = vfmadd231ps_fma(auVar22,auVar92,ZEXT1632(auVar69));
    auVar104 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar86));
    auVar94 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar69));
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar104 = vmulps_avx512vl(auVar104,auVar95);
    auVar94 = vmulps_avx512vl(auVar94,auVar95);
    auVar188._0_4_ = fVar206 * auVar104._0_4_;
    auVar188._4_4_ = fVar206 * auVar104._4_4_;
    auVar188._8_4_ = fVar206 * auVar104._8_4_;
    auVar188._12_4_ = fVar206 * auVar104._12_4_;
    auVar188._16_4_ = fVar206 * auVar104._16_4_;
    auVar188._20_4_ = fVar206 * auVar104._20_4_;
    auVar188._24_4_ = fVar206 * auVar104._24_4_;
    auVar188._28_4_ = 0;
    auVar104 = vmulps_avx512vl(auVar194,auVar94);
    auVar69 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
    auVar94 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar138._0_4_ = auVar188._0_4_ + auVar82._0_4_;
    auVar138._4_4_ = auVar188._4_4_ + auVar82._4_4_;
    auVar138._8_4_ = auVar188._8_4_ + auVar82._8_4_;
    auVar138._12_4_ = auVar188._12_4_ + auVar82._12_4_;
    auVar138._16_4_ = auVar188._16_4_ + 0.0;
    auVar138._20_4_ = auVar188._20_4_ + 0.0;
    auVar138._24_4_ = auVar188._24_4_ + 0.0;
    auVar138._28_4_ = 0;
    auVar107 = ZEXT1632(auVar69);
    auVar97 = vpermt2ps_avx512vl(auVar188,_DAT_01fb9fc0,auVar107);
    auVar89 = vaddps_avx512vl(ZEXT1632(auVar85),auVar104);
    auVar90 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar107);
    auVar104 = vsubps_avx(auVar94,auVar97);
    auVar97 = vsubps_avx512vl(auVar96,auVar90);
    auVar90 = vmulps_avx512vl(auVar88,auVar103);
    auVar102 = vmulps_avx512vl(auVar105,auVar103);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar87);
    auVar87 = vmulps_avx512vl(auVar99,auVar103);
    auVar102 = vmulps_avx512vl(auVar106,auVar103);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar88);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar105);
    auVar88 = vmulps_avx512vl(auVar100,auVar103);
    auVar100 = vmulps_avx512vl(auVar101,auVar103);
    auVar86 = vfmadd231ps_fma(auVar88,auVar92,auVar99);
    auVar88 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar106);
    auVar99 = vmulps_avx512vl(auVar103,auVar87);
    auVar101 = ZEXT1632(auVar72);
    auVar100 = vmulps_avx512vl(auVar101,auVar105);
    auVar90 = vfmadd231ps_avx512vl(auVar99,auVar92,auVar90);
    auVar98 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar98);
    auVar88 = vmulps_avx512vl(auVar101,auVar88);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar86._12_4_,
                                            CONCAT48(fVar215 * auVar86._8_4_,
                                                     CONCAT44(fVar205 * auVar86._4_4_,
                                                              fVar204 * auVar86._0_4_)))),auVar92,
                         auVar87);
    auVar105 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar105);
    auVar23._4_4_ = fVar205 * auVar87._4_4_;
    auVar23._0_4_ = fVar204 * auVar87._0_4_;
    auVar23._8_4_ = fVar215 * auVar87._8_4_;
    auVar23._12_4_ = fVar216 * auVar87._12_4_;
    auVar23._16_4_ = auVar87._16_4_ * 0.0;
    auVar23._20_4_ = auVar87._20_4_ * 0.0;
    auVar23._24_4_ = auVar87._24_4_ * 0.0;
    auVar23._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(auVar101,auVar105);
    auVar88 = vfmadd231ps_avx512vl(auVar23,auVar92,auVar90);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar92);
    auVar92 = vsubps_avx512vl(auVar87,auVar90);
    auVar105 = vsubps_avx512vl(auVar105,auVar98);
    auVar92 = vmulps_avx512vl(auVar92,auVar95);
    auVar105 = vmulps_avx512vl(auVar105,auVar95);
    fVar196 = fVar206 * auVar92._0_4_;
    fVar204 = fVar206 * auVar92._4_4_;
    auVar24._4_4_ = fVar204;
    auVar24._0_4_ = fVar196;
    fVar205 = fVar206 * auVar92._8_4_;
    auVar24._8_4_ = fVar205;
    fVar215 = fVar206 * auVar92._12_4_;
    auVar24._12_4_ = fVar215;
    fVar216 = fVar206 * auVar92._16_4_;
    auVar24._16_4_ = fVar216;
    fVar217 = fVar206 * auVar92._20_4_;
    auVar24._20_4_ = fVar217;
    fVar206 = fVar206 * auVar92._24_4_;
    auVar24._24_4_ = fVar206;
    auVar24._28_4_ = auVar92._28_4_;
    auVar105 = vmulps_avx512vl(auVar194,auVar105);
    auVar95 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar107);
    auVar90 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar107);
    auVar195._0_4_ = auVar88._0_4_ + fVar196;
    auVar195._4_4_ = auVar88._4_4_ + fVar204;
    auVar195._8_4_ = auVar88._8_4_ + fVar205;
    auVar195._12_4_ = auVar88._12_4_ + fVar215;
    auVar195._16_4_ = auVar88._16_4_ + fVar216;
    auVar195._20_4_ = auVar88._20_4_ + fVar217;
    auVar195._24_4_ = auVar88._24_4_ + fVar206;
    auVar195._28_4_ = auVar88._28_4_ + auVar92._28_4_;
    auVar92 = vpermt2ps_avx512vl(auVar24,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar98 = vaddps_avx512vl(auVar106,auVar105);
    auVar105 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar92 = vsubps_avx(auVar95,auVar92);
    auVar105 = vsubps_avx512vl(auVar90,auVar105);
    auVar152 = ZEXT1632(auVar82);
    auVar87 = vsubps_avx512vl(auVar88,auVar152);
    auVar162 = ZEXT1632(auVar85);
    auVar99 = vsubps_avx512vl(auVar106,auVar162);
    auVar100 = vsubps_avx512vl(auVar95,auVar94);
    auVar87 = vaddps_avx512vl(auVar87,auVar100);
    auVar100 = vsubps_avx512vl(auVar90,auVar96);
    auVar99 = vaddps_avx512vl(auVar99,auVar100);
    auVar100 = vmulps_avx512vl(auVar162,auVar87);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar152,auVar99);
    auVar101 = vmulps_avx512vl(auVar89,auVar87);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar138,auVar99);
    auVar102 = vmulps_avx512vl(auVar97,auVar87);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar104,auVar99);
    auVar103 = vmulps_avx512vl(auVar96,auVar87);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar94,auVar99);
    auVar107 = vmulps_avx512vl(auVar106,auVar87);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar88,auVar99);
    auVar108 = vmulps_avx512vl(auVar98,auVar87);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar195,auVar99);
    auVar109 = vmulps_avx512vl(auVar105,auVar87);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar92,auVar99);
    auVar87 = vmulps_avx512vl(auVar90,auVar87);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar95,auVar99);
    auVar99 = vminps_avx512vl(auVar100,auVar101);
    auVar100 = vmaxps_avx512vl(auVar100,auVar101);
    auVar101 = vminps_avx512vl(auVar102,auVar103);
    auVar99 = vminps_avx512vl(auVar99,auVar101);
    auVar101 = vmaxps_avx512vl(auVar102,auVar103);
    auVar100 = vmaxps_avx512vl(auVar100,auVar101);
    auVar101 = vminps_avx512vl(auVar107,auVar108);
    auVar102 = vmaxps_avx512vl(auVar107,auVar108);
    auVar103 = vminps_avx512vl(auVar109,auVar87);
    auVar101 = vminps_avx512vl(auVar101,auVar103);
    auVar99 = vminps_avx512vl(auVar99,auVar101);
    auVar87 = vmaxps_avx512vl(auVar109,auVar87);
    auVar87 = vmaxps_avx512vl(auVar102,auVar87);
    auVar87 = vmaxps_avx512vl(auVar100,auVar87);
    uVar15 = vcmpps_avx512vl(auVar99,auVar93,2);
    uVar16 = vcmpps_avx512vl(auVar87,auVar91,5);
    bVar29 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar29 != 0) {
      auVar87 = vsubps_avx512vl(auVar94,auVar152);
      auVar99 = vsubps_avx512vl(auVar96,auVar162);
      auVar100 = vsubps_avx512vl(auVar95,auVar88);
      auVar87 = vaddps_avx512vl(auVar87,auVar100);
      auVar100 = vsubps_avx512vl(auVar90,auVar106);
      auVar99 = vaddps_avx512vl(auVar99,auVar100);
      auVar100 = vmulps_avx512vl(auVar162,auVar87);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar99,auVar152);
      auVar89 = vmulps_avx512vl(auVar89,auVar87);
      auVar89 = vfnmadd213ps_avx512vl(auVar138,auVar99,auVar89);
      auVar97 = vmulps_avx512vl(auVar97,auVar87);
      auVar97 = vfnmadd213ps_avx512vl(auVar104,auVar99,auVar97);
      auVar104 = vmulps_avx512vl(auVar96,auVar87);
      auVar96 = vfnmadd231ps_avx512vl(auVar104,auVar99,auVar94);
      auVar104 = vmulps_avx512vl(auVar106,auVar87);
      auVar106 = vfnmadd231ps_avx512vl(auVar104,auVar99,auVar88);
      auVar104 = vmulps_avx512vl(auVar98,auVar87);
      auVar98 = vfnmadd213ps_avx512vl(auVar195,auVar99,auVar104);
      auVar104 = vmulps_avx512vl(auVar105,auVar87);
      auVar88 = vfnmadd213ps_avx512vl(auVar92,auVar99,auVar104);
      auVar92 = vmulps_avx512vl(auVar90,auVar87);
      auVar95 = vfnmadd231ps_avx512vl(auVar92,auVar95,auVar99);
      auVar104 = vminps_avx(auVar100,auVar89);
      auVar92 = vmaxps_avx(auVar100,auVar89);
      auVar94 = vminps_avx(auVar97,auVar96);
      auVar94 = vminps_avx(auVar104,auVar94);
      auVar104 = vmaxps_avx(auVar97,auVar96);
      auVar92 = vmaxps_avx(auVar92,auVar104);
      auVar105 = vminps_avx(auVar106,auVar98);
      auVar104 = vmaxps_avx(auVar106,auVar98);
      auVar106 = vminps_avx(auVar88,auVar95);
      auVar105 = vminps_avx(auVar105,auVar106);
      auVar105 = vminps_avx(auVar94,auVar105);
      auVar94 = vmaxps_avx(auVar88,auVar95);
      auVar104 = vmaxps_avx(auVar104,auVar94);
      auVar92 = vmaxps_avx(auVar92,auVar104);
      uVar15 = vcmpps_avx512vl(auVar92,auVar91,5);
      uVar16 = vcmpps_avx512vl(auVar105,auVar93,2);
      bVar29 = bVar29 & (byte)uVar15 & (byte)uVar16;
      if (bVar29 != 0) {
        mask_stack[uVar31] = (uint)bVar29;
        BVar2 = (BBox1f)vmovlps_avx(auVar49);
        cu_stack[uVar31] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar80);
        cv_stack[uVar31] = BVar2;
        uVar31 = (ulong)((int)uVar31 + 1);
      }
    }
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar237 = ZEXT1664(auVar49);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar238 = ZEXT1664(auVar49);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar239 = ZEXT1664(auVar49);
    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar240 = ZEXT3264(auVar92);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar241 = ZEXT1664(auVar49);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar242 = ZEXT1664(auVar49);
    auVar243 = ZEXT3264(_DAT_01fb9fe0);
LAB_019f82da:
    do {
      do {
        do {
          if ((int)uVar31 == 0) {
            uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar19._4_4_ = uVar130;
            auVar19._0_4_ = uVar130;
            auVar19._8_4_ = uVar130;
            auVar19._12_4_ = uVar130;
            auVar19._16_4_ = uVar130;
            auVar19._20_4_ = uVar130;
            auVar19._24_4_ = uVar130;
            auVar19._28_4_ = uVar130;
            uVar15 = vcmpps_avx512vl(local_78,auVar19,2);
            uVar35 = (ulong)((uint)uVar35 & (uint)uVar15);
            goto LAB_019f7678;
          }
          uVar30 = (int)uVar31 - 1;
          uVar9 = mask_stack[uVar30];
          auVar80._8_8_ = 0;
          auVar80._0_4_ = cv_stack[uVar30].lower;
          auVar80._4_4_ = cv_stack[uVar30].upper;
          uVar36 = 0;
          for (uVar34 = (ulong)uVar9; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
          {
            uVar36 = uVar36 + 1;
          }
          uVar33 = uVar9 - 1 & uVar9;
          bVar39 = uVar33 == 0;
          mask_stack[uVar30] = uVar33;
          if (bVar39) {
            uVar31 = (ulong)uVar30;
          }
          auVar124._8_8_ = 0;
          auVar124._0_8_ = uVar36;
          auVar49 = vpunpcklqdq_avx(auVar124,ZEXT416((int)uVar36 + 1));
          auVar49 = vcvtqq2ps_avx512vl(auVar49);
          auVar49 = vmulps_avx512vl(auVar49,auVar241._0_16_);
          fVar206 = cu_stack[uVar30].upper;
          auVar84._4_4_ = fVar206;
          auVar84._0_4_ = fVar206;
          auVar84._8_4_ = fVar206;
          auVar84._12_4_ = fVar206;
          auVar72 = vmulps_avx512vl(auVar49,auVar84);
          auVar86 = auVar242._0_16_;
          auVar49 = vsubps_avx512vl(auVar86,auVar49);
          fVar206 = cu_stack[uVar30].lower;
          auVar17._4_4_ = fVar206;
          auVar17._0_4_ = fVar206;
          auVar17._8_4_ = fVar206;
          auVar17._12_4_ = fVar206;
          auVar49 = vfmadd231ps_avx512vl(auVar72,auVar49,auVar17);
          auVar72 = vmovshdup_avx(auVar49);
          fVar206 = auVar72._0_4_ - auVar49._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          if (uVar9 == 0 || bVar39) goto LAB_019f7ddc;
          auVar72 = vshufps_avx(auVar80,auVar80,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          auVar71 = vsubps_avx512vl(auVar86,auVar72);
          fVar196 = auVar72._0_4_;
          auVar157._0_4_ = fVar196 * fVar128;
          fVar204 = auVar72._4_4_;
          auVar157._4_4_ = fVar204 * fVar129;
          fVar205 = auVar72._8_4_;
          auVar157._8_4_ = fVar205 * fVar128;
          fVar215 = auVar72._12_4_;
          auVar157._12_4_ = fVar215 * fVar129;
          auVar165._0_4_ = fVar196 * fVar139;
          auVar165._4_4_ = fVar204 * fVar150;
          auVar165._8_4_ = fVar205 * fVar139;
          auVar165._12_4_ = fVar215 * fVar150;
          auVar170._0_4_ = fVar196 * fVar154;
          auVar170._4_4_ = fVar204 * fVar155;
          auVar170._8_4_ = fVar205 * fVar154;
          auVar170._12_4_ = fVar215 * fVar155;
          auVar143._0_4_ = fVar196 * fVar156;
          auVar143._4_4_ = fVar204 * fVar207;
          auVar143._8_4_ = fVar205 * fVar156;
          auVar143._12_4_ = fVar215 * fVar207;
          auVar72 = vfmadd231ps_fma(auVar157,auVar71,auVar42);
          auVar69 = vfmadd231ps_fma(auVar165,auVar71,auVar44);
          auVar70 = vfmadd231ps_fma(auVar170,auVar71,auVar46);
          auVar71 = vfmadd231ps_fma(auVar143,auVar71,auVar131);
          auVar153._16_16_ = auVar72;
          auVar153._0_16_ = auVar72;
          auVar163._16_16_ = auVar69;
          auVar163._0_16_ = auVar69;
          auVar169._16_16_ = auVar70;
          auVar169._0_16_ = auVar70;
          auVar104 = vpermps_avx512vl(auVar243._0_32_,ZEXT1632(auVar49));
          auVar92 = vsubps_avx(auVar163,auVar153);
          auVar69 = vfmadd213ps_fma(auVar92,auVar104,auVar153);
          auVar92 = vsubps_avx(auVar169,auVar163);
          auVar82 = vfmadd213ps_fma(auVar92,auVar104,auVar163);
          auVar72 = vsubps_avx(auVar71,auVar70);
          auVar164._16_16_ = auVar72;
          auVar164._0_16_ = auVar72;
          auVar72 = vfmadd213ps_fma(auVar164,auVar104,auVar169);
          auVar92 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar92,auVar104,ZEXT1632(auVar69));
          auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar82));
          auVar72 = vfmadd213ps_fma(auVar92,auVar104,ZEXT1632(auVar82));
          auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar69));
          auVar134 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar92,auVar104);
          auVar92 = vmulps_avx512vl(auVar92,auVar240._0_32_);
          auVar111._16_16_ = auVar92._16_16_;
          fVar196 = fVar206 * 0.33333334;
          auVar171._0_8_ =
               CONCAT44(auVar134._4_4_ + fVar196 * auVar92._4_4_,
                        auVar134._0_4_ + fVar196 * auVar92._0_4_);
          auVar171._8_4_ = auVar134._8_4_ + fVar196 * auVar92._8_4_;
          auVar171._12_4_ = auVar134._12_4_ + fVar196 * auVar92._12_4_;
          auVar158._0_4_ = fVar196 * auVar92._16_4_;
          auVar158._4_4_ = fVar196 * auVar92._20_4_;
          auVar158._8_4_ = fVar196 * auVar92._24_4_;
          auVar158._12_4_ = fVar196 * auVar92._28_4_;
          auVar79 = vsubps_avx((undefined1  [16])0x0,auVar158);
          auVar82 = vshufpd_avx(auVar134,auVar134,3);
          auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar72 = vsubps_avx(auVar82,auVar134);
          auVar69 = vsubps_avx(auVar85,(undefined1  [16])0x0);
          auVar180._0_4_ = auVar72._0_4_ + auVar69._0_4_;
          auVar180._4_4_ = auVar72._4_4_ + auVar69._4_4_;
          auVar180._8_4_ = auVar72._8_4_ + auVar69._8_4_;
          auVar180._12_4_ = auVar72._12_4_ + auVar69._12_4_;
          auVar72 = vshufps_avx(auVar134,auVar134,0xb1);
          auVar69 = vshufps_avx(auVar171,auVar171,0xb1);
          auVar70 = vshufps_avx(auVar79,auVar79,0xb1);
          auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar228._4_4_ = auVar180._0_4_;
          auVar228._0_4_ = auVar180._0_4_;
          auVar228._8_4_ = auVar180._0_4_;
          auVar228._12_4_ = auVar180._0_4_;
          auVar75 = vshufps_avx(auVar180,auVar180,0x55);
          fVar196 = auVar75._0_4_;
          auVar189._0_4_ = auVar72._0_4_ * fVar196;
          fVar204 = auVar75._4_4_;
          auVar189._4_4_ = auVar72._4_4_ * fVar204;
          fVar205 = auVar75._8_4_;
          auVar189._8_4_ = auVar72._8_4_ * fVar205;
          fVar215 = auVar75._12_4_;
          auVar189._12_4_ = auVar72._12_4_ * fVar215;
          auVar197._0_4_ = auVar69._0_4_ * fVar196;
          auVar197._4_4_ = auVar69._4_4_ * fVar204;
          auVar197._8_4_ = auVar69._8_4_ * fVar205;
          auVar197._12_4_ = auVar69._12_4_ * fVar215;
          auVar208._0_4_ = auVar70._0_4_ * fVar196;
          auVar208._4_4_ = auVar70._4_4_ * fVar204;
          auVar208._8_4_ = auVar70._8_4_ * fVar205;
          auVar208._12_4_ = auVar70._12_4_ * fVar215;
          auVar181._0_4_ = auVar71._0_4_ * fVar196;
          auVar181._4_4_ = auVar71._4_4_ * fVar204;
          auVar181._8_4_ = auVar71._8_4_ * fVar205;
          auVar181._12_4_ = auVar71._12_4_ * fVar215;
          auVar72 = vfmadd231ps_fma(auVar189,auVar228,auVar134);
          auVar69 = vfmadd231ps_fma(auVar197,auVar228,auVar171);
          auVar77 = vfmadd231ps_fma(auVar208,auVar228,auVar79);
          auVar78 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar228);
          auVar75 = vshufpd_avx(auVar72,auVar72,1);
          auVar76 = vshufpd_avx(auVar69,auVar69,1);
          auVar73 = vshufpd_avx512vl(auVar77,auVar77,1);
          auVar74 = vshufpd_avx512vl(auVar78,auVar78,1);
          auVar70 = vminss_avx(auVar72,auVar69);
          auVar72 = vmaxss_avx(auVar69,auVar72);
          auVar71 = vminss_avx(auVar77,auVar78);
          auVar69 = vmaxss_avx(auVar78,auVar77);
          auVar70 = vminss_avx(auVar70,auVar71);
          auVar72 = vmaxss_avx(auVar69,auVar72);
          auVar71 = vminss_avx(auVar75,auVar76);
          auVar69 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vminss_avx512f(auVar73,auVar74);
          auVar76 = vmaxss_avx512f(auVar74,auVar73);
          auVar69 = vmaxss_avx(auVar76,auVar69);
          auVar71 = vminss_avx512f(auVar71,auVar75);
          fVar204 = auVar69._0_4_;
          fVar196 = auVar72._0_4_;
          if (auVar70._0_4_ < 0.0001) {
            bVar40 = fVar204 == -0.0001;
            bVar37 = NAN(fVar204);
            if (fVar204 <= -0.0001) goto LAB_019f850c;
            break;
          }
LAB_019f850c:
          vucomiss_avx512f(auVar71);
          bVar40 = fVar204 <= -0.0001;
          bVar38 = -0.0001 < fVar196;
          bVar37 = bVar40;
          if (!bVar40) break;
          uVar15 = vcmpps_avx512vl(auVar70,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar16 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar30 = (uint)uVar15 & (uint)uVar16;
          bVar25 = (uVar30 & 1) == 0;
          bVar40 = bVar38 && bVar25;
          bVar37 = bVar38 && (uVar30 & 1) == 0;
        } while (!bVar38 || !bVar25);
        auVar77 = auVar245._0_16_;
        vcmpss_avx512f(auVar70,auVar77,1);
        uVar15 = vcmpss_avx512f(auVar72,auVar77,1);
        bVar38 = (bool)((byte)uVar15 & 1);
        auVar111._0_16_ = auVar246._0_16_;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar246._0_4_);
        vucomiss_avx512f(auVar110._0_16_);
        bVar37 = (bool)(!bVar40 | bVar37);
        bVar38 = bVar37 == false;
        auVar113._16_16_ = auVar111._16_16_;
        auVar113._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar37 * auVar245._0_4_ + (uint)!bVar37 * 0x7f800000;
        auVar76 = auVar112._0_16_;
        auVar115._16_16_ = auVar111._16_16_;
        auVar115._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar114._4_28_ = auVar115._4_28_;
        auVar114._0_4_ = (uint)bVar37 * auVar245._0_4_ + (uint)!bVar37 * -0x800000;
        auVar75 = auVar114._0_16_;
        uVar15 = vcmpss_avx512f(auVar71,auVar77,1);
        bVar40 = (bool)((byte)uVar15 & 1);
        auVar117._16_16_ = auVar111._16_16_;
        auVar117._0_16_ = auVar246._0_16_;
        auVar116._4_28_ = auVar117._4_28_;
        auVar116._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar246._0_4_);
        vucomiss_avx512f(auVar116._0_16_);
        if ((bVar37) || (bVar38)) {
          auVar71 = vucomiss_avx512f(auVar70);
          if ((bVar37) || (bVar38)) {
            auVar78 = vxorps_avx512vl(auVar70,auVar239._0_16_);
            auVar70 = vsubss_avx512f(auVar71,auVar70);
            auVar70 = vdivss_avx512f(auVar78,auVar70);
            auVar71 = vsubss_avx512f(ZEXT416(0x3f800000),auVar70);
            auVar71 = vfmadd213ss_avx512f(auVar71,auVar77,auVar70);
            auVar70 = auVar71;
          }
          else {
            auVar70 = vxorps_avx512vl(auVar71,auVar71);
            vucomiss_avx512f(auVar70);
            auVar71 = ZEXT416(0x3f800000);
            if ((bVar37) || (bVar38)) {
              auVar71 = SUB6416(ZEXT464(0xff800000),0);
              auVar70 = ZEXT416(0x7f800000);
            }
          }
          auVar76 = vminss_avx512f(auVar76,auVar70);
          auVar75 = vmaxss_avx(auVar71,auVar75);
        }
        auVar246 = ZEXT464(0x3f800000);
        uVar15 = vcmpss_avx512f(auVar69,auVar77,1);
        bVar40 = (bool)((byte)uVar15 & 1);
        auVar69 = auVar246._0_16_;
        fVar205 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * 0x3f800000);
        if ((auVar110._0_4_ != fVar205) || (NAN(auVar110._0_4_) || NAN(fVar205))) {
          if ((fVar204 != fVar196) || (NAN(fVar204) || NAN(fVar196))) {
            auVar72 = vxorps_avx512vl(auVar72,auVar239._0_16_);
            auVar182._0_4_ = auVar72._0_4_ / (fVar204 - fVar196);
            auVar182._4_12_ = auVar72._4_12_;
            auVar72 = vsubss_avx512f(auVar69,auVar182);
            auVar72 = vfmadd213ss_avx512f(auVar72,auVar77,auVar182);
            auVar70 = auVar72;
          }
          else if ((fVar196 != 0.0) ||
                  (auVar72 = auVar69, auVar70 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar196))) {
            auVar72 = SUB6416(ZEXT464(0xff800000),0);
            auVar70 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar76 = vminss_avx(auVar76,auVar70);
          auVar75 = vmaxss_avx(auVar72,auVar75);
        }
        bVar40 = auVar116._0_4_ != fVar205;
        auVar72 = vminss_avx512f(auVar76,auVar69);
        auVar119._16_16_ = auVar111._16_16_;
        auVar119._0_16_ = auVar76;
        auVar118._4_28_ = auVar119._4_28_;
        auVar118._0_4_ = (uint)bVar40 * auVar72._0_4_ + (uint)!bVar40 * auVar76._0_4_;
        auVar72 = vmaxss_avx512f(auVar69,auVar75);
        auVar121._16_16_ = auVar111._16_16_;
        auVar121._0_16_ = auVar75;
        auVar120._4_28_ = auVar121._4_28_;
        auVar120._0_4_ = (uint)bVar40 * auVar72._0_4_ + (uint)!bVar40 * auVar75._0_4_;
        auVar72 = vmaxss_avx512f(auVar77,auVar118._0_16_);
        auVar70 = vminss_avx512f(auVar120._0_16_,auVar69);
      } while (auVar70._0_4_ < auVar72._0_4_);
      auVar77 = vmaxss_avx512f(auVar77,ZEXT416((uint)(auVar72._0_4_ + -0.1)));
      auVar78 = vminss_avx512f(ZEXT416((uint)(auVar70._0_4_ + 0.1)),auVar69);
      auVar144._0_8_ = auVar134._0_8_;
      auVar144._8_8_ = auVar144._0_8_;
      auVar198._8_8_ = auVar171._0_8_;
      auVar198._0_8_ = auVar171._0_8_;
      auVar209._8_8_ = auVar79._0_8_;
      auVar209._0_8_ = auVar79._0_8_;
      auVar72 = vshufpd_avx(auVar171,auVar171,3);
      auVar70 = vshufpd_avx(auVar79,auVar79,3);
      auVar71 = vshufps_avx(auVar77,auVar78,0);
      auVar76 = vsubps_avx512vl(auVar86,auVar71);
      fVar196 = auVar71._0_4_;
      auVar166._0_4_ = fVar196 * auVar82._0_4_;
      fVar204 = auVar71._4_4_;
      auVar166._4_4_ = fVar204 * auVar82._4_4_;
      fVar205 = auVar71._8_4_;
      auVar166._8_4_ = fVar205 * auVar82._8_4_;
      fVar215 = auVar71._12_4_;
      auVar166._12_4_ = fVar215 * auVar82._12_4_;
      auVar172._0_4_ = fVar196 * auVar72._0_4_;
      auVar172._4_4_ = fVar204 * auVar72._4_4_;
      auVar172._8_4_ = fVar205 * auVar72._8_4_;
      auVar172._12_4_ = fVar215 * auVar72._12_4_;
      auVar232._0_4_ = auVar70._0_4_ * fVar196;
      auVar232._4_4_ = auVar70._4_4_ * fVar204;
      auVar232._8_4_ = auVar70._8_4_ * fVar205;
      auVar232._12_4_ = auVar70._12_4_ * fVar215;
      auVar159._0_4_ = fVar196 * auVar85._0_4_;
      auVar159._4_4_ = fVar204 * auVar85._4_4_;
      auVar159._8_4_ = fVar205 * auVar85._8_4_;
      auVar159._12_4_ = fVar215 * auVar85._12_4_;
      auVar82 = vfmadd231ps_fma(auVar166,auVar76,auVar144);
      auVar85 = vfmadd231ps_fma(auVar172,auVar76,auVar198);
      auVar75 = vfmadd231ps_fma(auVar232,auVar76,auVar209);
      auVar76 = vfmadd231ps_fma(auVar159,auVar76,ZEXT816(0));
      auVar70 = vsubss_avx512f(auVar69,auVar77);
      auVar72 = vmovshdup_avx(auVar80);
      auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar77._0_4_)),auVar80,auVar70);
      auVar70 = vsubss_avx512f(auVar69,auVar78);
      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar78._0_4_)),auVar80,auVar70);
      auVar79 = vdivss_avx512f(auVar69,ZEXT416((uint)fVar206));
      auVar80 = vsubps_avx(auVar85,auVar82);
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar70 = vmulps_avx512vl(auVar80,auVar77);
      auVar80 = vsubps_avx(auVar75,auVar85);
      auVar71 = vmulps_avx512vl(auVar80,auVar77);
      auVar80 = vsubps_avx(auVar76,auVar75);
      auVar80 = vmulps_avx512vl(auVar80,auVar77);
      auVar72 = vminps_avx(auVar71,auVar80);
      auVar80 = vmaxps_avx(auVar71,auVar80);
      auVar72 = vminps_avx(auVar70,auVar72);
      auVar80 = vmaxps_avx(auVar70,auVar80);
      auVar70 = vshufpd_avx(auVar72,auVar72,3);
      auVar71 = vshufpd_avx(auVar80,auVar80,3);
      auVar72 = vminps_avx(auVar72,auVar70);
      auVar80 = vmaxps_avx(auVar80,auVar71);
      fVar206 = auVar79._0_4_;
      auVar183._0_4_ = auVar72._0_4_ * fVar206;
      auVar183._4_4_ = auVar72._4_4_ * fVar206;
      auVar183._8_4_ = auVar72._8_4_ * fVar206;
      auVar183._12_4_ = auVar72._12_4_ * fVar206;
      auVar175._0_4_ = fVar206 * auVar80._0_4_;
      auVar175._4_4_ = fVar206 * auVar80._4_4_;
      auVar175._8_4_ = fVar206 * auVar80._8_4_;
      auVar175._12_4_ = fVar206 * auVar80._12_4_;
      auVar79 = vdivss_avx512f(auVar69,ZEXT416((uint)(auVar73._0_4_ - auVar134._0_4_)));
      auVar80 = vshufpd_avx(auVar82,auVar82,3);
      auVar72 = vshufpd_avx(auVar85,auVar85,3);
      auVar70 = vshufpd_avx(auVar75,auVar75,3);
      auVar71 = vshufpd_avx(auVar76,auVar76,3);
      auVar80 = vsubps_avx(auVar80,auVar82);
      auVar82 = vsubps_avx(auVar72,auVar85);
      auVar85 = vsubps_avx(auVar70,auVar75);
      auVar71 = vsubps_avx(auVar71,auVar76);
      auVar72 = vminps_avx(auVar80,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar82);
      auVar70 = vminps_avx(auVar85,auVar71);
      auVar70 = vminps_avx(auVar72,auVar70);
      auVar72 = vmaxps_avx(auVar85,auVar71);
      auVar80 = vmaxps_avx(auVar80,auVar72);
      fVar206 = auVar79._0_4_;
      auVar210._0_4_ = fVar206 * auVar70._0_4_;
      auVar210._4_4_ = fVar206 * auVar70._4_4_;
      auVar210._8_4_ = fVar206 * auVar70._8_4_;
      auVar210._12_4_ = fVar206 * auVar70._12_4_;
      auVar199._0_4_ = fVar206 * auVar80._0_4_;
      auVar199._4_4_ = fVar206 * auVar80._4_4_;
      auVar199._8_4_ = fVar206 * auVar80._8_4_;
      auVar199._12_4_ = fVar206 * auVar80._12_4_;
      auVar71 = vinsertps_avx(auVar49,auVar134,0x10);
      auVar74 = vpermt2ps_avx512vl(auVar49,_DAT_01fb9f90,auVar73);
      auVar132._0_4_ = auVar71._0_4_ + auVar74._0_4_;
      auVar132._4_4_ = auVar71._4_4_ + auVar74._4_4_;
      auVar132._8_4_ = auVar71._8_4_ + auVar74._8_4_;
      auVar132._12_4_ = auVar71._12_4_ + auVar74._12_4_;
      auVar79 = vmulps_avx512vl(auVar132,auVar237._0_16_);
      auVar72 = vshufps_avx(auVar79,auVar79,0x54);
      uVar130 = auVar79._0_4_;
      auVar135._4_4_ = uVar130;
      auVar135._0_4_ = uVar130;
      auVar135._8_4_ = uVar130;
      auVar135._12_4_ = uVar130;
      auVar70 = vfmadd213ps_fma(auVar41,auVar135,auVar5);
      auVar82 = vfmadd213ps_fma(auVar62,auVar135,auVar50);
      auVar85 = vfmadd213ps_fma(auVar63,auVar135,auVar123);
      auVar80 = vsubps_avx(auVar82,auVar70);
      auVar70 = vfmadd213ps_fma(auVar80,auVar135,auVar70);
      auVar80 = vsubps_avx(auVar85,auVar82);
      auVar80 = vfmadd213ps_fma(auVar80,auVar135,auVar82);
      auVar80 = vsubps_avx(auVar80,auVar70);
      auVar70 = vfmadd231ps_fma(auVar70,auVar80,auVar135);
      auVar75 = vmulps_avx512vl(auVar80,auVar77);
      auVar220._8_8_ = auVar70._0_8_;
      auVar220._0_8_ = auVar70._0_8_;
      auVar80 = vshufpd_avx(auVar70,auVar70,3);
      auVar70 = vshufps_avx(auVar79,auVar79,0x55);
      auVar82 = vsubps_avx(auVar80,auVar220);
      auVar85 = vfmadd231ps_fma(auVar220,auVar70,auVar82);
      auVar233._8_8_ = auVar75._0_8_;
      auVar233._0_8_ = auVar75._0_8_;
      auVar80 = vshufpd_avx(auVar75,auVar75,3);
      auVar80 = vsubps_avx512vl(auVar80,auVar233);
      auVar80 = vfmadd213ps_avx512vl(auVar80,auVar70,auVar233);
      auVar136._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
      auVar136._8_4_ = auVar82._8_4_ ^ 0x80000000;
      auVar136._12_4_ = auVar82._12_4_ ^ 0x80000000;
      auVar70 = vmovshdup_avx512vl(auVar80);
      auVar234._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
      auVar234._8_4_ = auVar70._8_4_ ^ 0x80000000;
      auVar234._12_4_ = auVar70._12_4_ ^ 0x80000000;
      auVar75 = vmovshdup_avx512vl(auVar82);
      auVar76 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar82);
      auVar81 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar245 = ZEXT1664(auVar81);
      auVar70 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar70._0_4_ * auVar82._0_4_)),auVar80,auVar75);
      auVar82 = vpermt2ps_avx512vl(auVar80,SUB6416(ZEXT464(4),0),auVar136);
      auVar160._0_4_ = auVar70._0_4_;
      auVar160._4_4_ = auVar160._0_4_;
      auVar160._8_4_ = auVar160._0_4_;
      auVar160._12_4_ = auVar160._0_4_;
      auVar80 = vdivps_avx(auVar76,auVar160);
      auVar83 = vdivps_avx512vl(auVar82,auVar160);
      fVar206 = auVar85._0_4_;
      auVar70 = vshufps_avx(auVar85,auVar85,0x55);
      auVar221._0_4_ = fVar206 * auVar80._0_4_ + auVar70._0_4_ * auVar83._0_4_;
      auVar221._4_4_ = fVar206 * auVar80._4_4_ + auVar70._4_4_ * auVar83._4_4_;
      auVar221._8_4_ = fVar206 * auVar80._8_4_ + auVar70._8_4_ * auVar83._8_4_;
      auVar221._12_4_ = fVar206 * auVar80._12_4_ + auVar70._12_4_ * auVar83._12_4_;
      auVar77 = vsubps_avx(auVar72,auVar221);
      auVar70 = vmovshdup_avx(auVar80);
      auVar72 = vinsertps_avx(auVar183,auVar210,0x1c);
      auVar235._0_4_ = auVar70._0_4_ * auVar72._0_4_;
      auVar235._4_4_ = auVar70._4_4_ * auVar72._4_4_;
      auVar235._8_4_ = auVar70._8_4_ * auVar72._8_4_;
      auVar235._12_4_ = auVar70._12_4_ * auVar72._12_4_;
      auVar78 = vinsertps_avx512f(auVar175,auVar199,0x1c);
      auVar70 = vmulps_avx512vl(auVar70,auVar78);
      auVar76 = vminps_avx512vl(auVar235,auVar70);
      auVar85 = vmaxps_avx(auVar70,auVar235);
      auVar75 = vmovshdup_avx(auVar83);
      auVar70 = vinsertps_avx(auVar210,auVar183,0x4c);
      auVar211._0_4_ = auVar75._0_4_ * auVar70._0_4_;
      auVar211._4_4_ = auVar75._4_4_ * auVar70._4_4_;
      auVar211._8_4_ = auVar75._8_4_ * auVar70._8_4_;
      auVar211._12_4_ = auVar75._12_4_ * auVar70._12_4_;
      auVar82 = vinsertps_avx(auVar199,auVar175,0x4c);
      auVar200._0_4_ = auVar75._0_4_ * auVar82._0_4_;
      auVar200._4_4_ = auVar75._4_4_ * auVar82._4_4_;
      auVar200._8_4_ = auVar75._8_4_ * auVar82._8_4_;
      auVar200._12_4_ = auVar75._12_4_ * auVar82._12_4_;
      auVar75 = vminps_avx(auVar211,auVar200);
      auVar76 = vaddps_avx512vl(auVar76,auVar75);
      auVar75 = vmaxps_avx(auVar200,auVar211);
      auVar201._0_4_ = auVar85._0_4_ + auVar75._0_4_;
      auVar201._4_4_ = auVar85._4_4_ + auVar75._4_4_;
      auVar201._8_4_ = auVar85._8_4_ + auVar75._8_4_;
      auVar201._12_4_ = auVar85._12_4_ + auVar75._12_4_;
      auVar212._8_8_ = 0x3f80000000000000;
      auVar212._0_8_ = 0x3f80000000000000;
      auVar85 = vsubps_avx(auVar212,auVar201);
      auVar75 = vsubps_avx(auVar212,auVar76);
      auVar76 = vsubps_avx(auVar71,auVar79);
      auVar79 = vsubps_avx(auVar74,auVar79);
      fVar215 = auVar76._0_4_;
      auVar236._0_4_ = fVar215 * auVar85._0_4_;
      fVar216 = auVar76._4_4_;
      auVar236._4_4_ = fVar216 * auVar85._4_4_;
      fVar217 = auVar76._8_4_;
      auVar236._8_4_ = fVar217 * auVar85._8_4_;
      fVar218 = auVar76._12_4_;
      auVar236._12_4_ = fVar218 * auVar85._12_4_;
      auVar84 = vbroadcastss_avx512vl(auVar80);
      auVar72 = vmulps_avx512vl(auVar84,auVar72);
      auVar78 = vmulps_avx512vl(auVar84,auVar78);
      auVar84 = vminps_avx512vl(auVar72,auVar78);
      auVar78 = vmaxps_avx512vl(auVar78,auVar72);
      auVar72 = vbroadcastss_avx512vl(auVar83);
      auVar70 = vmulps_avx512vl(auVar72,auVar70);
      auVar72 = vmulps_avx512vl(auVar72,auVar82);
      auVar82 = vminps_avx512vl(auVar70,auVar72);
      auVar82 = vaddps_avx512vl(auVar84,auVar82);
      auVar76 = vmulps_avx512vl(auVar76,auVar75);
      fVar206 = auVar79._0_4_;
      auVar202._0_4_ = fVar206 * auVar85._0_4_;
      fVar196 = auVar79._4_4_;
      auVar202._4_4_ = fVar196 * auVar85._4_4_;
      fVar204 = auVar79._8_4_;
      auVar202._8_4_ = fVar204 * auVar85._8_4_;
      fVar205 = auVar79._12_4_;
      auVar202._12_4_ = fVar205 * auVar85._12_4_;
      auVar213._0_4_ = fVar206 * auVar75._0_4_;
      auVar213._4_4_ = fVar196 * auVar75._4_4_;
      auVar213._8_4_ = fVar204 * auVar75._8_4_;
      auVar213._12_4_ = fVar205 * auVar75._12_4_;
      auVar72 = vmaxps_avx(auVar72,auVar70);
      auVar176._0_4_ = auVar78._0_4_ + auVar72._0_4_;
      auVar176._4_4_ = auVar78._4_4_ + auVar72._4_4_;
      auVar176._8_4_ = auVar78._8_4_ + auVar72._8_4_;
      auVar176._12_4_ = auVar78._12_4_ + auVar72._12_4_;
      auVar184._8_8_ = 0x3f800000;
      auVar184._0_8_ = 0x3f800000;
      auVar72 = vsubps_avx(auVar184,auVar176);
      auVar70 = vsubps_avx512vl(auVar184,auVar82);
      auVar229._0_4_ = fVar215 * auVar72._0_4_;
      auVar229._4_4_ = fVar216 * auVar72._4_4_;
      auVar229._8_4_ = fVar217 * auVar72._8_4_;
      auVar229._12_4_ = fVar218 * auVar72._12_4_;
      auVar222._0_4_ = fVar215 * auVar70._0_4_;
      auVar222._4_4_ = fVar216 * auVar70._4_4_;
      auVar222._8_4_ = fVar217 * auVar70._8_4_;
      auVar222._12_4_ = fVar218 * auVar70._12_4_;
      auVar177._0_4_ = fVar206 * auVar72._0_4_;
      auVar177._4_4_ = fVar196 * auVar72._4_4_;
      auVar177._8_4_ = fVar204 * auVar72._8_4_;
      auVar177._12_4_ = fVar205 * auVar72._12_4_;
      auVar185._0_4_ = fVar206 * auVar70._0_4_;
      auVar185._4_4_ = fVar196 * auVar70._4_4_;
      auVar185._8_4_ = fVar204 * auVar70._8_4_;
      auVar185._12_4_ = fVar205 * auVar70._12_4_;
      auVar72 = vminps_avx(auVar229,auVar222);
      auVar70 = vminps_avx512vl(auVar177,auVar185);
      auVar82 = vminps_avx512vl(auVar72,auVar70);
      auVar72 = vmaxps_avx(auVar222,auVar229);
      auVar70 = vmaxps_avx(auVar185,auVar177);
      auVar70 = vmaxps_avx(auVar70,auVar72);
      auVar85 = vminps_avx512vl(auVar236,auVar76);
      auVar72 = vminps_avx(auVar202,auVar213);
      auVar72 = vminps_avx(auVar85,auVar72);
      auVar72 = vhaddps_avx(auVar82,auVar72);
      auVar85 = vmaxps_avx512vl(auVar76,auVar236);
      auVar82 = vmaxps_avx(auVar213,auVar202);
      auVar82 = vmaxps_avx(auVar82,auVar85);
      auVar70 = vhaddps_avx(auVar70,auVar82);
      auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
      auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
      auVar178._0_4_ = auVar72._0_4_ + auVar77._0_4_;
      auVar178._4_4_ = auVar72._4_4_ + auVar77._4_4_;
      auVar178._8_4_ = auVar72._8_4_ + auVar77._8_4_;
      auVar178._12_4_ = auVar72._12_4_ + auVar77._12_4_;
      auVar186._0_4_ = auVar70._0_4_ + auVar77._0_4_;
      auVar186._4_4_ = auVar70._4_4_ + auVar77._4_4_;
      auVar186._8_4_ = auVar70._8_4_ + auVar77._8_4_;
      auVar186._12_4_ = auVar70._12_4_ + auVar77._12_4_;
      auVar72 = vmaxps_avx(auVar71,auVar178);
      auVar70 = vminps_avx(auVar186,auVar74);
      uVar36 = vcmpps_avx512vl(auVar70,auVar72,1);
    } while ((uVar36 & 3) != 0);
    uVar36 = vcmpps_avx512vl(auVar186,auVar74,1);
    uVar15 = vcmpps_avx512vl(auVar49,auVar178,1);
    if (((ushort)uVar15 & (ushort)uVar36 & 1) == 0) {
      bVar29 = 0;
    }
    else {
      auVar72 = vmovshdup_avx(auVar178);
      bVar29 = auVar134._0_4_ < auVar72._0_4_ & (byte)(uVar36 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar45._0_4_;
    p03.field_0.i[1] = auVar45._4_4_;
    p03.field_0.i[2] = auVar45._8_4_;
    p03.field_0.i[3] = auVar45._12_4_;
    if (((3 < (uint)uVar31 || uVar9 != 0 && !bVar39) | bVar29) == 1) {
      lVar32 = 0xc9;
      do {
        lVar32 = lVar32 + -1;
        if (lVar32 == 0) goto LAB_019f82da;
        auVar49 = vsubss_avx512f(auVar69,auVar77);
        fVar204 = auVar49._0_4_;
        fVar206 = fVar204 * fVar204 * fVar204;
        fVar205 = auVar77._0_4_;
        fVar196 = fVar205 * 3.0 * fVar204 * fVar204;
        fVar204 = fVar204 * fVar205 * fVar205 * 3.0;
        auVar151._4_4_ = fVar206;
        auVar151._0_4_ = fVar206;
        auVar151._8_4_ = fVar206;
        auVar151._12_4_ = fVar206;
        auVar145._4_4_ = fVar196;
        auVar145._0_4_ = fVar196;
        auVar145._8_4_ = fVar196;
        auVar145._12_4_ = fVar196;
        auVar125._4_4_ = fVar204;
        auVar125._0_4_ = fVar204;
        auVar125._8_4_ = fVar204;
        auVar125._12_4_ = fVar204;
        fVar205 = fVar205 * fVar205 * fVar205;
        auVar167._0_4_ = p03.field_0.v[0] * fVar205;
        auVar167._4_4_ = p03.field_0.v[1] * fVar205;
        auVar167._8_4_ = p03.field_0.v[2] * fVar205;
        auVar167._12_4_ = p03.field_0.v[3] * fVar205;
        auVar49 = vfmadd231ps_fma(auVar167,auVar123,auVar125);
        auVar49 = vfmadd231ps_fma(auVar49,auVar50,auVar145);
        auVar49 = vfmadd231ps_fma(auVar49,auVar5,auVar151);
        auVar126._8_8_ = auVar49._0_8_;
        auVar126._0_8_ = auVar49._0_8_;
        auVar49 = vshufpd_avx(auVar49,auVar49,3);
        auVar72 = vshufps_avx(auVar77,auVar77,0x55);
        auVar49 = vsubps_avx(auVar49,auVar126);
        auVar72 = vfmadd213ps_fma(auVar49,auVar72,auVar126);
        fVar206 = auVar72._0_4_;
        auVar49 = vshufps_avx(auVar72,auVar72,0x55);
        auVar127._0_4_ = auVar80._0_4_ * fVar206 + auVar83._0_4_ * auVar49._0_4_;
        auVar127._4_4_ = auVar80._4_4_ * fVar206 + auVar83._4_4_ * auVar49._4_4_;
        auVar127._8_4_ = auVar80._8_4_ * fVar206 + auVar83._8_4_ * auVar49._8_4_;
        auVar127._12_4_ = auVar80._12_4_ * fVar206 + auVar83._12_4_ * auVar49._12_4_;
        auVar77 = vsubps_avx(auVar77,auVar127);
        auVar49 = vandps_avx512vl(auVar72,auVar238._0_16_);
        auVar72 = vprolq_avx512vl(auVar49,0x20);
        auVar49 = vmaxss_avx(auVar72,auVar49);
        bVar39 = auVar49._0_4_ <= fVar122;
      } while (fVar122 <= auVar49._0_4_);
      auVar49 = vucomiss_avx512f(auVar81);
      if (bVar39) {
        auVar80 = vucomiss_avx512f(auVar49);
        auVar246 = ZEXT1664(auVar80);
        if (bVar39) {
          vmovshdup_avx(auVar49);
          auVar80 = vucomiss_avx512f(auVar81);
          if (bVar39) {
            auVar72 = vucomiss_avx512f(auVar80);
            auVar246 = ZEXT1664(auVar72);
            if (bVar39) {
              auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar79 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar69 = vdpps_avx(auVar79,auVar6,0x7f);
              auVar70 = vdpps_avx(auVar79,auVar57,0x7f);
              auVar71 = vdpps_avx(auVar79,auVar58,0x7f);
              auVar82 = vdpps_avx(auVar79,auVar59,0x7f);
              auVar85 = vdpps_avx(auVar79,auVar47,0x7f);
              auVar75 = vdpps_avx(auVar79,auVar60,0x7f);
              auVar76 = vdpps_avx(auVar79,auVar61,0x7f);
              auVar79 = vdpps_avx(auVar79,auVar43,0x7f);
              auVar77 = vsubss_avx512f(auVar72,auVar80);
              fVar205 = auVar80._0_4_;
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar85._0_4_)),auVar77,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar205)),auVar77,auVar70);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar205)),auVar77,auVar71);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar79._0_4_)),auVar77,auVar82);
              auVar72 = vsubss_avx512f(auVar72,auVar49);
              auVar187._0_4_ = auVar72._0_4_;
              fVar206 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
              local_d8 = auVar49._0_4_;
              fVar196 = local_d8 * 3.0 * auVar187._0_4_ * auVar187._0_4_;
              fVar204 = auVar187._0_4_ * local_d8 * local_d8 * 3.0;
              fVar216 = local_d8 * local_d8 * local_d8;
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar71._0_4_)),
                                        ZEXT416((uint)fVar204),auVar70);
              auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar196),auVar69);
              auVar80 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar206),auVar80);
              fVar215 = auVar80._0_4_;
              if ((fVar1 <= fVar215) &&
                 (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar215 <= fVar217)) {
                local_c8 = vshufps_avx(auVar49,auVar49,0x55);
                auVar86 = vsubps_avx512vl(auVar86,local_c8);
                fVar218 = local_c8._0_4_;
                auVar190._0_4_ = fVar218 * auVar231._0_4_;
                fVar225 = local_c8._4_4_;
                auVar190._4_4_ = fVar225 * auVar231._4_4_;
                fVar226 = local_c8._8_4_;
                auVar190._8_4_ = fVar226 * auVar231._8_4_;
                fVar227 = local_c8._12_4_;
                auVar190._12_4_ = fVar227 * auVar231._12_4_;
                local_288 = auVar55._0_4_;
                fStack_284 = auVar55._4_4_;
                fStack_280 = auVar55._8_4_;
                fStack_27c = auVar55._12_4_;
                auVar203._0_4_ = fVar218 * local_288;
                auVar203._4_4_ = fVar225 * fStack_284;
                auVar203._8_4_ = fVar226 * fStack_280;
                auVar203._12_4_ = fVar227 * fStack_27c;
                local_298 = auVar56._0_4_;
                fStack_294 = auVar56._4_4_;
                fStack_290 = auVar56._8_4_;
                fStack_28c = auVar56._12_4_;
                auVar214._0_4_ = fVar218 * local_298;
                auVar214._4_4_ = fVar225 * fStack_294;
                auVar214._8_4_ = fVar226 * fStack_290;
                auVar214._12_4_ = fVar227 * fStack_28c;
                auVar223._0_4_ = fVar218 * auVar219._0_4_;
                auVar223._4_4_ = fVar225 * auVar219._4_4_;
                auVar223._8_4_ = fVar226 * auVar219._8_4_;
                auVar223._12_4_ = fVar227 * auVar219._12_4_;
                auVar49 = vfmadd231ps_fma(auVar190,auVar86,auVar48);
                auVar80 = vfmadd231ps_fma(auVar203,auVar86,auVar53);
                auVar72 = vfmadd231ps_fma(auVar214,auVar86,auVar54);
                auVar86 = vfmadd231ps_fma(auVar223,auVar86,auVar52);
                auVar49 = vsubps_avx(auVar80,auVar49);
                auVar80 = vsubps_avx(auVar72,auVar80);
                auVar72 = vsubps_avx(auVar86,auVar72);
                auVar224._0_4_ = local_d8 * auVar80._0_4_;
                auVar224._4_4_ = local_d8 * auVar80._4_4_;
                auVar224._8_4_ = local_d8 * auVar80._8_4_;
                auVar224._12_4_ = local_d8 * auVar80._12_4_;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar49 = vfmadd231ps_fma(auVar224,auVar187,auVar49);
                auVar191._0_4_ = local_d8 * auVar72._0_4_;
                auVar191._4_4_ = local_d8 * auVar72._4_4_;
                auVar191._8_4_ = local_d8 * auVar72._8_4_;
                auVar191._12_4_ = local_d8 * auVar72._12_4_;
                auVar80 = vfmadd231ps_fma(auVar191,auVar187,auVar80);
                auVar192._0_4_ = local_d8 * auVar80._0_4_;
                auVar192._4_4_ = local_d8 * auVar80._4_4_;
                auVar192._8_4_ = local_d8 * auVar80._8_4_;
                auVar192._12_4_ = local_d8 * auVar80._12_4_;
                auVar49 = vfmadd231ps_fma(auVar192,auVar187,auVar49);
                auVar18._8_4_ = 0x40400000;
                auVar18._0_8_ = 0x4040000040400000;
                auVar18._12_4_ = 0x40400000;
                auVar49 = vmulps_avx512vl(auVar49,auVar18);
                pGVar10 = (context->scene->geometries).items[uVar7].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar66._0_4_;
                  fStack_2d4 = auVar66._4_4_;
                  fStack_2d0 = auVar66._8_4_;
                  fStack_2cc = auVar66._12_4_;
                  auVar173._0_4_ = fVar216 * local_2d8;
                  auVar173._4_4_ = fVar216 * fStack_2d4;
                  auVar173._8_4_ = fVar216 * fStack_2d0;
                  auVar173._12_4_ = fVar216 * fStack_2cc;
                  auVar168._4_4_ = fVar204;
                  auVar168._0_4_ = fVar204;
                  auVar168._8_4_ = fVar204;
                  auVar168._12_4_ = fVar204;
                  auVar80 = vfmadd132ps_fma(auVar168,auVar173,auVar65);
                  auVar161._4_4_ = fVar196;
                  auVar161._0_4_ = fVar196;
                  auVar161._8_4_ = fVar196;
                  auVar161._12_4_ = fVar196;
                  auVar80 = vfmadd132ps_fma(auVar161,auVar80,auVar64);
                  auVar146._4_4_ = fVar206;
                  auVar146._0_4_ = fVar206;
                  auVar146._8_4_ = fVar206;
                  auVar146._12_4_ = fVar206;
                  auVar86 = vfmadd132ps_fma(auVar146,auVar80,auVar51);
                  auVar80 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar72 = vshufps_avx(auVar49,auVar49,0xc9);
                  auVar147._0_4_ = auVar86._0_4_ * auVar72._0_4_;
                  auVar147._4_4_ = auVar86._4_4_ * auVar72._4_4_;
                  auVar147._8_4_ = auVar86._8_4_ * auVar72._8_4_;
                  auVar147._12_4_ = auVar86._12_4_ * auVar72._12_4_;
                  auVar49 = vfmsub231ps_fma(auVar147,auVar49,auVar80);
                  local_e8 = auVar49._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar215;
                    uVar130 = vextractps_avx(auVar49,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar130;
                    uVar130 = vextractps_avx(auVar49,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar130;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar205;
                    *(uint *)(ray + k * 4 + 0x110) = uVar8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar7;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_019f82da;
                  }
                  auVar80 = vshufps_avx(auVar49,auVar49,0x55);
                  local_f8 = vshufps_avx(auVar49,auVar49,0xaa);
                  local_108[0] = (RTCHitN)auVar80[0];
                  local_108[1] = (RTCHitN)auVar80[1];
                  local_108[2] = (RTCHitN)auVar80[2];
                  local_108[3] = (RTCHitN)auVar80[3];
                  local_108[4] = (RTCHitN)auVar80[4];
                  local_108[5] = (RTCHitN)auVar80[5];
                  local_108[6] = (RTCHitN)auVar80[6];
                  local_108[7] = (RTCHitN)auVar80[7];
                  local_108[8] = (RTCHitN)auVar80[8];
                  local_108[9] = (RTCHitN)auVar80[9];
                  local_108[10] = (RTCHitN)auVar80[10];
                  local_108[0xb] = (RTCHitN)auVar80[0xb];
                  local_108[0xc] = (RTCHitN)auVar80[0xc];
                  local_108[0xd] = (RTCHitN)auVar80[0xd];
                  local_108[0xe] = (RTCHitN)auVar80[0xe];
                  local_108[0xf] = (RTCHitN)auVar80[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_2f8 = auVar68._0_8_;
                  uStack_2f0 = auVar68._8_8_;
                  local_b8 = local_2f8;
                  uStack_b0 = uStack_2f0;
                  local_a8 = auVar67;
                  vpcmpeqd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar67));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar215;
                  args.valid = (int *)local_358;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_358 = auVar14;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->intersectionFilterN)(&args);
                    auVar49 = vxorps_avx512vl(auVar81,auVar81);
                    auVar245 = ZEXT1664(auVar49);
                    auVar246 = ZEXT464(0x3f800000);
                    auVar243 = ZEXT3264(_DAT_01fb9fe0);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar242 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar241 = ZEXT1664(auVar49);
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar240 = ZEXT3264(auVar92);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar239 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar238 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar237 = ZEXT1664(auVar49);
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar244 = ZEXT3264(auVar92);
                  }
                  auVar49 = auVar245._0_16_;
                  uVar36 = vptestmd_avx512vl(local_358,local_358);
                  if ((uVar36 & 0xf) != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                      auVar49 = vxorps_avx512vl(auVar49,auVar49);
                      auVar245 = ZEXT1664(auVar49);
                      auVar246 = ZEXT464(0x3f800000);
                      auVar243 = ZEXT3264(_DAT_01fb9fe0);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar242 = ZEXT1664(auVar49);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar241 = ZEXT1664(auVar49);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar240 = ZEXT3264(auVar92);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar239 = ZEXT1664(auVar49);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar238 = ZEXT1664(auVar49);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar237 = ZEXT1664(auVar49);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar244 = ZEXT3264(auVar92);
                    }
                    uVar36 = vptestmd_avx512vl(local_358,local_358);
                    uVar36 = uVar36 & 0xf;
                    bVar29 = (byte)uVar36;
                    if (bVar29 != 0) {
                      iVar26 = *(int *)(args.hit + 4);
                      iVar27 = *(int *)(args.hit + 8);
                      iVar28 = *(int *)(args.hit + 0xc);
                      bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar37 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar29 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar39 * iVar26 | (uint)!bVar39 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar40 * iVar27 | (uint)!bVar40 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar37 * iVar28 | (uint)!bVar37 * *(int *)(args.ray + 0xcc);
                      iVar26 = *(int *)(args.hit + 0x14);
                      iVar27 = *(int *)(args.hit + 0x18);
                      iVar28 = *(int *)(args.hit + 0x1c);
                      bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar37 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar29 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar39 * iVar26 | (uint)!bVar39 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar40 * iVar27 | (uint)!bVar40 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar37 * iVar28 | (uint)!bVar37 * *(int *)(args.ray + 0xdc);
                      iVar26 = *(int *)(args.hit + 0x24);
                      iVar27 = *(int *)(args.hit + 0x28);
                      iVar28 = *(int *)(args.hit + 0x2c);
                      bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar37 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar29 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar39 * iVar26 | (uint)!bVar39 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar40 * iVar27 | (uint)!bVar40 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar37 * iVar28 | (uint)!bVar37 * *(int *)(args.ray + 0xec);
                      iVar26 = *(int *)(args.hit + 0x34);
                      iVar27 = *(int *)(args.hit + 0x38);
                      iVar28 = *(int *)(args.hit + 0x3c);
                      bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar37 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar29 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar39 * iVar26 | (uint)!bVar39 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar40 * iVar27 | (uint)!bVar40 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar37 * iVar28 | (uint)!bVar37 * *(int *)(args.ray + 0xfc);
                      iVar26 = *(int *)(args.hit + 0x44);
                      iVar27 = *(int *)(args.hit + 0x48);
                      iVar28 = *(int *)(args.hit + 0x4c);
                      bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar37 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar29 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar29 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar39 * iVar26 | (uint)!bVar39 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar40 * iVar27 | (uint)!bVar40 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar37 * iVar28 | (uint)!bVar37 * *(int *)(args.ray + 0x10c);
                      auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar49;
                      auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar49;
                      auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar49;
                      auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar49;
                      goto LAB_019f82da;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar217;
                }
              }
            }
          }
        }
      }
      goto LAB_019f82da;
    }
    auVar80 = vinsertps_avx(auVar134,auVar73,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }